

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O0

void aom_lpf_horizontal_6_quad_sse2(uchar *s,int p,uchar *_blimit0,uchar *_limit0,uchar *_thresh0)

{
  ushort uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined6 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined6 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined6 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  undefined6 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  longlong lVar77;
  longlong lVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  ulong uVar89;
  undefined8 uVar90;
  ulong *puVar91;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  undefined8 *in_R8;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  ulong extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_07;
  undefined8 extraout_XMM0_Qa_08;
  ulong extraout_XMM0_Qa_09;
  undefined8 extraout_XMM0_Qa_10;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  ulong extraout_XMM0_Qb_02;
  ulong uVar96;
  undefined1 auVar94 [16];
  ulong uVar93;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  ulong uVar97;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined1 auVar95 [16];
  undefined8 extraout_XMM0_Qb_07;
  undefined8 extraout_XMM0_Qb_08;
  ulong extraout_XMM0_Qb_09;
  undefined8 extraout_XMM0_Qb_10;
  __m128i alVar98;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i f8_hi;
  __m128i f8_lo;
  __m128i q2_hi;
  __m128i q1_hi;
  __m128i q0_hi;
  __m128i p0_hi;
  __m128i p1_hi;
  __m128i p2_hi;
  __m128i q2_lo;
  __m128i q1_lo;
  __m128i q0_lo;
  __m128i p0_lo;
  __m128i p1_lo;
  __m128i p2_lo;
  __m128i four;
  __m128i filter2;
  __m128i filter1;
  __m128i work_a;
  __m128i filt;
  __m128i ff_1;
  __m128i t7f;
  __m128i t1;
  __m128i t1f;
  __m128i te0;
  __m128i t80;
  __m128i t3;
  __m128i t4;
  __m128i work_1;
  __m128i work;
  __m128i abs_p1q1;
  __m128i abs_p0q0;
  __m128i ff;
  __m128i fe;
  __m128i abs_q1q0;
  __m128i abs_p1p0;
  __m128i max_abs_p1p0q1q0;
  __m128i oq1;
  __m128i oq0;
  __m128i op0;
  __m128i op1;
  __m128i q2;
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i p2;
  __m128i flat;
  __m128i hev;
  __m128i mask;
  __m128i thresh_v;
  __m128i limit_v;
  __m128i blimit_v;
  __m128i one;
  __m128i zero;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined1 local_11b8;
  char cStack_11b7;
  undefined1 uStack_11b6;
  char cStack_11b5;
  undefined1 uStack_11b4;
  char cStack_11b3;
  undefined1 uStack_11b2;
  char cStack_11b1;
  undefined1 uStack_11b0;
  char cStack_11af;
  undefined1 uStack_11ae;
  char cStack_11ad;
  undefined1 uStack_11ac;
  char cStack_11ab;
  undefined1 uStack_11aa;
  char cStack_11a9;
  undefined1 local_11a8;
  char cStack_11a7;
  undefined1 uStack_11a6;
  char cStack_11a5;
  undefined1 uStack_11a4;
  char cStack_11a3;
  undefined1 uStack_11a2;
  char cStack_11a1;
  undefined1 uStack_11a0;
  char cStack_119f;
  undefined1 uStack_119e;
  char cStack_119d;
  undefined1 uStack_119c;
  char cStack_119b;
  undefined1 uStack_119a;
  char cStack_1199;
  undefined1 local_1198;
  char cStack_1197;
  undefined1 uStack_1196;
  char cStack_1195;
  undefined1 uStack_1194;
  char cStack_1193;
  undefined1 uStack_1192;
  char cStack_1191;
  undefined1 uStack_1190;
  char cStack_118f;
  undefined1 uStack_118e;
  char cStack_118d;
  undefined1 uStack_118c;
  char cStack_118b;
  undefined1 uStack_118a;
  char cStack_1189;
  undefined1 local_1188;
  char cStack_1187;
  undefined1 uStack_1186;
  char cStack_1185;
  undefined1 uStack_1184;
  char cStack_1183;
  undefined1 uStack_1182;
  char cStack_1181;
  undefined1 uStack_1180;
  char cStack_117f;
  undefined1 uStack_117e;
  char cStack_117d;
  undefined1 uStack_117c;
  char cStack_117b;
  undefined1 uStack_117a;
  char cStack_1179;
  undefined1 local_1178;
  char cStack_1177;
  undefined1 uStack_1176;
  char cStack_1175;
  undefined1 uStack_1174;
  char cStack_1173;
  undefined1 uStack_1172;
  char cStack_1171;
  undefined1 uStack_1170;
  char cStack_116f;
  undefined1 uStack_116e;
  char cStack_116d;
  undefined1 uStack_116c;
  char cStack_116b;
  undefined1 uStack_116a;
  char cStack_1169;
  undefined1 local_1168;
  char cStack_1167;
  undefined1 uStack_1166;
  char cStack_1165;
  undefined1 uStack_1164;
  char cStack_1163;
  undefined1 uStack_1162;
  char cStack_1161;
  undefined1 uStack_1160;
  char cStack_115f;
  undefined1 uStack_115e;
  char cStack_115d;
  undefined1 uStack_115c;
  char cStack_115b;
  undefined1 uStack_115a;
  char cStack_1159;
  undefined1 local_1158;
  char cStack_1157;
  undefined1 uStack_1156;
  char cStack_1155;
  undefined1 uStack_1154;
  char cStack_1153;
  undefined1 uStack_1152;
  char cStack_1151;
  undefined1 uStack_1150;
  char cStack_114f;
  undefined1 uStack_114e;
  char cStack_114d;
  undefined1 uStack_114c;
  char cStack_114b;
  undefined1 uStack_114a;
  char cStack_1149;
  undefined1 local_1148;
  char cStack_1147;
  undefined1 uStack_1146;
  char cStack_1145;
  undefined1 uStack_1144;
  char cStack_1143;
  undefined1 uStack_1142;
  char cStack_1141;
  undefined1 uStack_1140;
  char cStack_113f;
  undefined1 uStack_113e;
  char cStack_113d;
  undefined1 uStack_113c;
  char cStack_113b;
  undefined1 uStack_113a;
  char cStack_1139;
  undefined1 local_1138;
  char cStack_1137;
  undefined1 uStack_1136;
  char cStack_1135;
  undefined1 uStack_1134;
  char cStack_1133;
  undefined1 uStack_1132;
  char cStack_1131;
  undefined1 uStack_1130;
  char cStack_112f;
  undefined1 uStack_112e;
  char cStack_112d;
  undefined1 uStack_112c;
  char cStack_112b;
  undefined1 uStack_112a;
  char cStack_1129;
  undefined1 local_1128;
  char cStack_1127;
  undefined1 uStack_1126;
  char cStack_1125;
  undefined1 uStack_1124;
  char cStack_1123;
  undefined1 uStack_1122;
  char cStack_1121;
  undefined1 uStack_1120;
  char cStack_111f;
  undefined1 uStack_111e;
  char cStack_111d;
  undefined1 uStack_111c;
  char cStack_111b;
  undefined1 uStack_111a;
  char cStack_1119;
  undefined1 local_1118;
  char cStack_1117;
  undefined1 uStack_1116;
  char cStack_1115;
  undefined1 uStack_1114;
  char cStack_1113;
  undefined1 uStack_1112;
  char cStack_1111;
  undefined1 uStack_1110;
  char cStack_110f;
  undefined1 uStack_110e;
  char cStack_110d;
  undefined1 uStack_110c;
  char cStack_110b;
  undefined1 uStack_110a;
  char cStack_1109;
  undefined1 local_1108;
  char cStack_1107;
  undefined1 uStack_1106;
  char cStack_1105;
  undefined1 uStack_1104;
  char cStack_1103;
  undefined1 uStack_1102;
  char cStack_1101;
  undefined1 uStack_1100;
  char cStack_10ff;
  undefined1 uStack_10fe;
  char cStack_10fd;
  undefined1 uStack_10fc;
  char cStack_10fb;
  undefined1 uStack_10fa;
  char cStack_10f9;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined1 local_10a8;
  undefined1 uStack_10a7;
  undefined1 uStack_10a6;
  undefined1 uStack_10a5;
  undefined1 uStack_10a4;
  undefined1 uStack_10a3;
  undefined1 uStack_10a2;
  undefined1 uStack_10a1;
  undefined1 uStack_10a0;
  undefined1 uStack_109f;
  undefined1 uStack_109e;
  undefined1 uStack_109d;
  undefined1 uStack_109c;
  undefined1 uStack_109b;
  undefined1 uStack_109a;
  undefined1 uStack_1099;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  byte local_1028;
  byte bStack_1027;
  byte bStack_1026;
  byte bStack_1025;
  byte bStack_1024;
  byte bStack_1023;
  byte bStack_1022;
  byte bStack_1021;
  byte bStack_1020;
  byte bStack_101f;
  byte bStack_101e;
  byte bStack_101d;
  byte bStack_101c;
  byte bStack_101b;
  byte bStack_101a;
  byte bStack_1019;
  byte local_1018;
  byte bStack_1017;
  byte bStack_1016;
  byte bStack_1015;
  byte bStack_1014;
  byte bStack_1013;
  byte bStack_1012;
  byte bStack_1011;
  byte bStack_1010;
  byte bStack_100f;
  byte bStack_100e;
  byte bStack_100d;
  byte bStack_100c;
  byte bStack_100b;
  byte bStack_100a;
  byte bStack_1009;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined1 local_ff8 [16];
  undefined1 local_fe8;
  undefined1 uStack_fe7;
  undefined1 uStack_fe6;
  undefined1 uStack_fe5;
  undefined1 uStack_fe4;
  undefined1 uStack_fe3;
  undefined1 uStack_fe2;
  undefined1 uStack_fe1;
  undefined1 uStack_fe0;
  undefined1 uStack_fdf;
  undefined1 uStack_fde;
  undefined1 uStack_fdd;
  undefined1 uStack_fdc;
  undefined1 uStack_fdb;
  undefined1 uStack_fda;
  undefined1 uStack_fd9;
  ulong local_fd8;
  ulong uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  byte local_fa8;
  byte bStack_fa7;
  byte bStack_fa6;
  byte bStack_fa5;
  byte bStack_fa4;
  byte bStack_fa3;
  byte bStack_fa2;
  byte bStack_fa1;
  byte bStack_fa0;
  byte bStack_f9f;
  byte bStack_f9e;
  byte bStack_f9d;
  byte bStack_f9c;
  byte bStack_f9b;
  byte bStack_f9a;
  byte bStack_f99;
  ulong local_f98;
  ulong uStack_f90;
  ulong local_f88;
  ulong uStack_f80;
  ulong local_f78;
  ulong uStack_f70;
  ulong local_f68;
  ulong uStack_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  ulong local_f48;
  ulong uStack_f40;
  ulong local_f38;
  ulong uStack_f30;
  ulong local_f28;
  ulong uStack_f20;
  ulong local_f18;
  ulong uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  ulong local_ee8;
  ulong uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  int local_e54;
  ulong *local_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  ulong uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  ulong uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  ulong uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  ulong uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 *local_d58;
  ulong *local_d50;
  ulong *local_d40;
  ulong *local_d38;
  undefined8 *local_d30;
  ulong *local_c70;
  undefined8 *local_c50;
  undefined8 *local_c30;
  undefined1 local_c21;
  undefined1 local_c20;
  undefined1 local_c1f;
  undefined1 local_c1e;
  undefined1 local_c1d;
  undefined1 local_c1c;
  undefined1 local_c1b;
  undefined1 local_c1a;
  undefined1 local_c19;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  byte local_af8;
  byte bStack_af7;
  byte bStack_af6;
  byte bStack_af5;
  byte bStack_af4;
  byte bStack_af3;
  byte bStack_af2;
  byte bStack_af1;
  byte bStack_af0;
  byte bStack_aef;
  byte bStack_aee;
  byte bStack_aed;
  byte bStack_aec;
  byte bStack_aeb;
  byte bStack_aea;
  byte bStack_ae9;
  byte local_ae8;
  byte bStack_ae7;
  byte bStack_ae6;
  byte bStack_ae5;
  byte bStack_ae4;
  byte bStack_ae3;
  byte bStack_ae2;
  byte bStack_ae1;
  byte bStack_ae0;
  byte bStack_adf;
  byte bStack_ade;
  byte bStack_add;
  byte bStack_adc;
  byte bStack_adb;
  byte bStack_ada;
  byte bStack_ad9;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  byte local_ab8;
  byte bStack_ab7;
  byte bStack_ab6;
  byte bStack_ab5;
  byte bStack_ab4;
  byte bStack_ab3;
  byte bStack_ab2;
  byte bStack_ab1;
  byte bStack_ab0;
  byte bStack_aaf;
  byte bStack_aae;
  byte bStack_aad;
  byte bStack_aac;
  byte bStack_aab;
  byte bStack_aaa;
  byte bStack_aa9;
  byte local_aa8;
  byte bStack_aa7;
  byte bStack_aa6;
  byte bStack_aa5;
  byte bStack_aa4;
  byte bStack_aa3;
  byte bStack_aa2;
  byte bStack_aa1;
  byte bStack_aa0;
  byte bStack_a9f;
  byte bStack_a9e;
  byte bStack_a9d;
  byte bStack_a9c;
  byte bStack_a9b;
  byte bStack_a9a;
  byte bStack_a99;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined4 local_a0c;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined4 local_9ec;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined4 local_9cc;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined4 local_9ac;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  ulong local_988;
  ulong uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  ulong local_968;
  ulong uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  ulong local_948;
  ulong uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  ulong local_928;
  ulong uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  ulong local_908;
  ulong uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  ulong local_8e8;
  ulong uStack_8e0;
  ulong local_8d8;
  ulong uStack_8d0;
  ulong local_8c8;
  ulong uStack_8c0;
  ulong local_8b8;
  ulong uStack_8b0;
  undefined1 local_8a8 [16];
  ulong local_898;
  ulong uStack_890;
  ulong local_888;
  ulong uStack_880;
  ulong local_878;
  ulong uStack_870;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  longlong local_828;
  longlong lStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined1 local_7e8 [16];
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined1 local_7c8 [16];
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined1 local_7a8 [16];
  undefined8 local_798;
  undefined8 uStack_790;
  undefined1 local_788 [16];
  undefined8 local_778;
  undefined8 uStack_770;
  undefined1 local_768 [16];
  undefined8 local_758;
  undefined8 uStack_750;
  char local_748;
  char cStack_747;
  char cStack_746;
  char cStack_745;
  char cStack_744;
  char cStack_743;
  char cStack_742;
  char cStack_741;
  char cStack_740;
  char cStack_73f;
  char cStack_73e;
  char cStack_73d;
  char cStack_73c;
  char cStack_73b;
  char cStack_73a;
  char cStack_739;
  undefined8 local_738;
  undefined8 uStack_730;
  ulong local_728;
  ulong uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  ulong local_708;
  ulong uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  ulong local_6e8;
  ulong uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  ulong local_6c8;
  ulong uStack_6c0;
  ulong local_6b8;
  ulong uStack_6b0;
  char local_6a8;
  char cStack_6a7;
  char cStack_6a6;
  char cStack_6a5;
  char cStack_6a4;
  char cStack_6a3;
  char cStack_6a2;
  char cStack_6a1;
  char cStack_6a0;
  char cStack_69f;
  char cStack_69e;
  char cStack_69d;
  char cStack_69c;
  char cStack_69b;
  char cStack_69a;
  char cStack_699;
  char local_698;
  char cStack_697;
  char cStack_696;
  char cStack_695;
  char cStack_694;
  char cStack_693;
  char cStack_692;
  char cStack_691;
  char cStack_690;
  char cStack_68f;
  char cStack_68e;
  char cStack_68d;
  char cStack_68c;
  char cStack_68b;
  char cStack_68a;
  byte bStack_689;
  char local_688;
  char cStack_687;
  char cStack_686;
  char cStack_685;
  char cStack_684;
  char cStack_683;
  char cStack_682;
  char cStack_681;
  char cStack_680;
  char cStack_67f;
  char cStack_67e;
  char cStack_67d;
  char cStack_67c;
  char cStack_67b;
  char cStack_67a;
  byte bStack_679;
  ulong local_678;
  ulong uStack_670;
  ulong local_668;
  ulong uStack_660;
  ulong local_658;
  ulong uStack_650;
  ulong local_648;
  ulong uStack_640;
  ulong local_638;
  ulong uStack_630;
  ulong local_628;
  ulong uStack_620;
  ulong local_618;
  ulong uStack_610;
  ulong local_608;
  ulong uStack_600;
  ulong local_5f8;
  ulong uStack_5f0;
  ulong local_5e8;
  ulong uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  ulong local_5c8;
  ulong uStack_5c0;
  ulong local_5b8;
  ulong uStack_5b0;
  ulong local_5a8;
  ulong uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  ulong local_588;
  ulong uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  ulong local_568;
  ulong uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  ulong local_508;
  ulong uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  ulong local_498;
  ulong uStack_490;
  ulong local_488;
  ulong uStack_480;
  ulong local_478;
  ulong uStack_470;
  ulong local_468;
  ulong uStack_460;
  ulong local_458;
  ulong uStack_450;
  ulong local_448;
  ulong uStack_440;
  ulong local_438;
  ulong uStack_430;
  ulong local_428;
  ulong uStack_420;
  undefined2 local_40a;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  ulong local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  ulong local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  ulong local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  ulong local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  longlong local_348;
  longlong lStack_340;
  short local_338;
  short sStack_336;
  short sStack_334;
  short sStack_332;
  short sStack_330;
  short sStack_32e;
  short sStack_32c;
  short sStack_32a;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  short local_308;
  short sStack_306;
  short sStack_304;
  short sStack_302;
  short sStack_300;
  short sStack_2fe;
  short sStack_2fc;
  short sStack_2fa;
  short local_2f8;
  short sStack_2f6;
  short sStack_2f4;
  short sStack_2f2;
  short sStack_2f0;
  short sStack_2ee;
  short sStack_2ec;
  short sStack_2ea;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  longlong local_2c8;
  longlong lStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  short local_2a8;
  short sStack_2a6;
  short sStack_2a4;
  short sStack_2a2;
  short sStack_2a0;
  short sStack_29e;
  short sStack_29c;
  short sStack_29a;
  short local_298;
  short sStack_296;
  short sStack_294;
  short sStack_292;
  short sStack_290;
  short sStack_28e;
  short sStack_28c;
  short sStack_28a;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  longlong local_248;
  longlong lStack_240;
  short local_238;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  short local_208;
  short sStack_206;
  short sStack_204;
  short sStack_202;
  short sStack_200;
  short sStack_1fe;
  short sStack_1fc;
  short sStack_1fa;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  longlong local_1c8;
  longlong lStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short sStack_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined1 local_138;
  undefined1 local_137;
  undefined1 local_136;
  undefined1 local_135;
  undefined1 local_134;
  undefined1 local_133;
  undefined1 local_132;
  undefined1 local_131;
  undefined1 local_130;
  undefined1 local_12f;
  undefined1 local_12e;
  undefined1 local_12d;
  undefined1 local_12c;
  undefined1 local_12b;
  undefined1 local_12a;
  undefined1 local_129;
  ulong local_128;
  ulong uStack_120;
  undefined1 local_118;
  undefined1 local_117;
  undefined1 local_116;
  undefined1 local_115;
  undefined1 local_114;
  undefined1 local_113;
  undefined1 local_112;
  undefined1 local_111;
  undefined1 local_110;
  undefined1 local_10f;
  undefined1 local_10e;
  undefined1 local_10d;
  undefined1 local_10c;
  undefined1 local_10b;
  undefined1 local_10a;
  undefined1 local_109;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 local_f8;
  undefined1 local_f7;
  undefined1 local_f6;
  undefined1 local_f5;
  undefined1 local_f4;
  undefined1 local_f3;
  undefined1 local_f2;
  undefined1 local_f1;
  undefined1 local_f0;
  undefined1 local_ef;
  undefined1 local_ee;
  undefined1 local_ed;
  undefined1 local_ec;
  undefined1 local_eb;
  undefined1 local_ea;
  undefined1 local_e9;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8;
  undefined1 local_d7;
  undefined1 local_d6;
  undefined1 local_d5;
  undefined1 local_d4;
  undefined1 local_d3;
  undefined1 local_d2;
  undefined1 local_d1;
  undefined1 local_d0;
  undefined1 local_cf;
  undefined1 local_ce;
  undefined1 local_cd;
  undefined1 local_cc;
  undefined1 local_cb;
  undefined1 local_ca;
  undefined1 local_c9;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8;
  undefined1 local_b7;
  undefined1 local_b6;
  undefined1 local_b5;
  undefined1 local_b4;
  undefined1 local_b3;
  undefined1 local_b2;
  undefined1 local_b1;
  undefined1 local_b0;
  undefined1 local_af;
  undefined1 local_ae;
  undefined1 local_ad;
  undefined1 local_ac;
  undefined1 local_ab;
  undefined1 local_aa;
  undefined1 local_a9;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98;
  undefined1 local_97;
  undefined1 local_96;
  undefined1 local_95;
  undefined1 local_94;
  undefined1 local_93;
  undefined1 local_92;
  undefined1 local_91;
  undefined1 local_90;
  undefined1 local_8f;
  undefined1 local_8e;
  undefined1 local_8d;
  undefined1 local_8c;
  undefined1 local_8b;
  undefined1 local_8a;
  undefined1 local_89;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78;
  undefined1 local_77;
  undefined1 local_76;
  undefined1 local_75;
  undefined1 local_74;
  undefined1 local_73;
  undefined1 local_72;
  undefined1 local_71;
  undefined1 local_70;
  undefined1 local_6f;
  undefined1 local_6e;
  undefined1 local_6d;
  undefined1 local_6c;
  undefined1 local_6b;
  undefined1 local_6a;
  undefined1 local_69;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58;
  undefined1 local_57;
  undefined1 local_56;
  undefined1 local_55;
  undefined1 local_54;
  undefined1 local_53;
  undefined1 local_52;
  undefined1 local_51;
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  undefined1 local_30;
  undefined1 local_2f;
  undefined1 local_2e;
  undefined1 local_2d;
  undefined1 local_2c;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  ulong uVar92;
  
  local_e54 = (int)in_RSI;
  local_e48 = 0;
  uStack_e40 = 0;
  local_e88 = 0;
  uStack_e80 = 0;
  local_c19 = 1;
  local_129 = 1;
  local_12a = 1;
  local_12b = 1;
  local_12c = 1;
  local_12d = 1;
  local_12e = 1;
  local_12f = 1;
  local_130 = 1;
  local_131 = 1;
  local_132 = 1;
  local_133 = 1;
  local_134 = 1;
  local_135 = 1;
  local_136 = 1;
  local_137 = 1;
  local_138 = 1;
  local_e98 = 0x101010101010101;
  uStack_e90 = 0x101010101010101;
  local_ea8 = *in_RDX;
  uStack_ea0 = in_RDX[1];
  local_eb8 = *in_RCX;
  uStack_eb0 = in_RCX[1];
  local_ec8 = *in_R8;
  uStack_ec0 = in_R8[1];
  b[0] = in_RSI & 0xffffffff;
  local_d30 = (undefined8 *)((long)in_RDI - (long)(local_e54 * 3));
  local_f08 = *local_d30;
  uStack_f00 = local_d30[1];
  local_d38 = (ulong *)((long)in_RDI - (long)(local_e54 * 2));
  local_f18 = *local_d38;
  uStack_f10 = local_d38[1];
  local_d40 = (ulong *)((long)in_RDI - (long)local_e54);
  local_f28 = *local_d40;
  uStack_f20 = local_d40[1];
  local_f38 = *in_RDI;
  uStack_f30 = in_RDI[1];
  local_d50 = (ulong *)((long)in_RDI + (long)local_e54);
  local_f48 = *local_d50;
  uStack_f40 = local_d50[1];
  b[1] = (long)(local_e54 * 2);
  local_d58 = (undefined8 *)((long)in_RDI + b[1]);
  local_f58 = *local_d58;
  uStack_f50 = local_d58[1];
  alVar98[1] = in_RSI;
  alVar98[0] = (longlong)in_RDI;
  local_e50 = in_RDI;
  local_148 = local_e98;
  uStack_140 = uStack_e90;
  alVar98 = abs_diff(alVar98,b);
  b_00[0] = alVar98[1];
  a[1] = in_RSI;
  a[0] = (longlong)in_RDI;
  b_00[1] = b[1];
  local_fb8 = extraout_XMM0_Qa;
  uStack_fb0 = extraout_XMM0_Qb;
  alVar98 = abs_diff(a,b_00);
  b_01[0] = alVar98[1];
  local_c1a = 0xfe;
  local_109 = 0xfe;
  local_10a = 0xfe;
  local_10b = 0xfe;
  local_10c = 0xfe;
  local_10d = 0xfe;
  local_10e = 0xfe;
  local_10f = 0xfe;
  local_110 = 0xfe;
  local_111 = 0xfe;
  local_112 = 0xfe;
  local_113 = 0xfe;
  local_114 = 0xfe;
  local_115 = 0xfe;
  local_116 = 0xfe;
  local_117 = 0xfe;
  local_118 = 0xfe;
  local_fd8 = 0xfefefefefefefefe;
  uStack_fd0 = 0xfefefefefefefefe;
  local_b28 = local_e88;
  uStack_b20 = uStack_e80;
  local_b38 = local_e88;
  uStack_b30 = uStack_e80;
  local_fe8 = 0xff;
  uStack_fe7 = 0xff;
  uStack_fe6 = 0xff;
  uStack_fe5 = 0xff;
  uStack_fe4 = 0xff;
  uStack_fe3 = 0xff;
  uStack_fe2 = 0xff;
  uStack_fe1 = 0xff;
  uStack_fe0 = 0xff;
  uStack_fdf = 0xff;
  uStack_fde = 0xff;
  uStack_fdd = 0xff;
  uStack_fdc = 0xff;
  uStack_fdb = 0xff;
  uStack_fda = 0xff;
  uStack_fd9 = 0xff;
  a_00[1] = in_RSI;
  a_00[0] = (longlong)in_RDI;
  b_01[1] = b[1];
  local_fc8 = extraout_XMM0_Qa_00;
  uStack_fc0 = extraout_XMM0_Qb_00;
  local_128 = local_fd8;
  uStack_120 = uStack_fd0;
  alVar98 = abs_diff(a_00,b_01);
  b_02[0] = alVar98[1];
  a_01[1] = in_RSI;
  a_01[0] = (longlong)in_RDI;
  b_02[1] = b[1];
  local_ff8._0_8_ = extraout_XMM0_Qa_01;
  local_ff8._8_8_ = extraout_XMM0_Qb_01;
  alVar98 = abs_diff(a_01,b_02);
  b_03[0] = alVar98[1];
  local_a68 = local_fb8;
  uVar81 = local_a68;
  uStack_a60 = uStack_fb0;
  uVar82 = uStack_a60;
  local_a78 = local_fc8;
  uVar79 = local_a78;
  uStack_a70 = uStack_fc0;
  uVar80 = uStack_a70;
  local_a68._0_1_ = (byte)local_fb8;
  local_a68._1_1_ = (byte)((ulong)local_fb8 >> 8);
  local_a68._2_1_ = (byte)((ulong)local_fb8 >> 0x10);
  local_a68._3_1_ = (byte)((ulong)local_fb8 >> 0x18);
  local_a68._4_1_ = (byte)((ulong)local_fb8 >> 0x20);
  local_a68._5_1_ = (byte)((ulong)local_fb8 >> 0x28);
  local_a68._6_1_ = (byte)((ulong)local_fb8 >> 0x30);
  local_a68._7_1_ = (byte)((ulong)local_fb8 >> 0x38);
  uStack_a60._0_1_ = (byte)uStack_fb0;
  uStack_a60._1_1_ = (byte)((ulong)uStack_fb0 >> 8);
  uStack_a60._2_1_ = (byte)((ulong)uStack_fb0 >> 0x10);
  uStack_a60._3_1_ = (byte)((ulong)uStack_fb0 >> 0x18);
  uStack_a60._4_1_ = (byte)((ulong)uStack_fb0 >> 0x20);
  uStack_a60._5_1_ = (byte)((ulong)uStack_fb0 >> 0x28);
  uStack_a60._6_1_ = (byte)((ulong)uStack_fb0 >> 0x30);
  uStack_a60._7_1_ = (byte)((ulong)uStack_fb0 >> 0x38);
  local_a78._0_1_ = (byte)local_fc8;
  local_a78._1_1_ = (byte)((ulong)local_fc8 >> 8);
  local_a78._2_1_ = (byte)((ulong)local_fc8 >> 0x10);
  local_a78._3_1_ = (byte)((ulong)local_fc8 >> 0x18);
  local_a78._4_1_ = (byte)((ulong)local_fc8 >> 0x20);
  local_a78._5_1_ = (byte)((ulong)local_fc8 >> 0x28);
  local_a78._6_1_ = (byte)((ulong)local_fc8 >> 0x30);
  local_a78._7_1_ = (byte)((ulong)local_fc8 >> 0x38);
  uStack_a70._0_1_ = (byte)uStack_fc0;
  uStack_a70._1_1_ = (byte)((ulong)uStack_fc0 >> 8);
  uStack_a70._2_1_ = (byte)((ulong)uStack_fc0 >> 0x10);
  uStack_a70._3_1_ = (byte)((ulong)uStack_fc0 >> 0x18);
  uStack_a70._4_1_ = (byte)((ulong)uStack_fc0 >> 0x20);
  uStack_a70._5_1_ = (byte)((ulong)uStack_fc0 >> 0x28);
  uStack_a70._6_1_ = (byte)((ulong)uStack_fc0 >> 0x30);
  uStack_a70._7_1_ = (byte)((ulong)uStack_fc0 >> 0x38);
  local_fa8 = ((byte)local_a68 < (byte)local_a78) * (byte)local_a78 |
              ((byte)local_a68 >= (byte)local_a78) * (byte)local_a68;
  bStack_fa7 = (local_a68._1_1_ < local_a78._1_1_) * local_a78._1_1_ |
               (local_a68._1_1_ >= local_a78._1_1_) * local_a68._1_1_;
  bStack_fa6 = (local_a68._2_1_ < local_a78._2_1_) * local_a78._2_1_ |
               (local_a68._2_1_ >= local_a78._2_1_) * local_a68._2_1_;
  bStack_fa5 = (local_a68._3_1_ < local_a78._3_1_) * local_a78._3_1_ |
               (local_a68._3_1_ >= local_a78._3_1_) * local_a68._3_1_;
  bStack_fa4 = (local_a68._4_1_ < local_a78._4_1_) * local_a78._4_1_ |
               (local_a68._4_1_ >= local_a78._4_1_) * local_a68._4_1_;
  bStack_fa3 = (local_a68._5_1_ < local_a78._5_1_) * local_a78._5_1_ |
               (local_a68._5_1_ >= local_a78._5_1_) * local_a68._5_1_;
  bStack_fa2 = (local_a68._6_1_ < local_a78._6_1_) * local_a78._6_1_ |
               (local_a68._6_1_ >= local_a78._6_1_) * local_a68._6_1_;
  bStack_fa1 = (local_a68._7_1_ < local_a78._7_1_) * local_a78._7_1_ |
               (local_a68._7_1_ >= local_a78._7_1_) * local_a68._7_1_;
  bStack_fa0 = ((byte)uStack_a60 < (byte)uStack_a70) * (byte)uStack_a70 |
               ((byte)uStack_a60 >= (byte)uStack_a70) * (byte)uStack_a60;
  bStack_f9f = (uStack_a60._1_1_ < uStack_a70._1_1_) * uStack_a70._1_1_ |
               (uStack_a60._1_1_ >= uStack_a70._1_1_) * uStack_a60._1_1_;
  bStack_f9e = (uStack_a60._2_1_ < uStack_a70._2_1_) * uStack_a70._2_1_ |
               (uStack_a60._2_1_ >= uStack_a70._2_1_) * uStack_a60._2_1_;
  bStack_f9d = (uStack_a60._3_1_ < uStack_a70._3_1_) * uStack_a70._3_1_ |
               (uStack_a60._3_1_ >= uStack_a70._3_1_) * uStack_a60._3_1_;
  bStack_f9c = (uStack_a60._4_1_ < uStack_a70._4_1_) * uStack_a70._4_1_ |
               (uStack_a60._4_1_ >= uStack_a70._4_1_) * uStack_a60._4_1_;
  bStack_f9b = (uStack_a60._5_1_ < uStack_a70._5_1_) * uStack_a70._5_1_ |
               (uStack_a60._5_1_ >= uStack_a70._5_1_) * uStack_a60._5_1_;
  bStack_f9a = (uStack_a60._6_1_ < uStack_a70._6_1_) * uStack_a70._6_1_ |
               (uStack_a60._6_1_ >= uStack_a70._6_1_) * uStack_a60._6_1_;
  bStack_f99 = (uStack_a60._7_1_ < uStack_a70._7_1_) * uStack_a70._7_1_ |
               (uStack_a60._7_1_ >= uStack_a70._7_1_) * uStack_a60._7_1_;
  local_a28 = local_ff8._0_8_;
  uStack_a20 = local_ff8._8_8_;
  local_a38 = local_ff8._0_8_;
  uStack_a30 = local_ff8._8_8_;
  auVar42._8_8_ = local_ff8._8_8_;
  auVar42._0_8_ = local_ff8._0_8_;
  auVar95._8_8_ = local_ff8._8_8_;
  auVar95._0_8_ = local_ff8._0_8_;
  local_ff8 = paddusb(auVar42,auVar95);
  local_878 = local_fd8;
  uStack_870 = uStack_fd0;
  uVar92 = extraout_XMM0_Qa_02 & local_fd8;
  uVar96 = extraout_XMM0_Qb_02 & uStack_fd0;
  local_9ac = 1;
  local_9a8._0_2_ = (ushort)uVar92;
  local_9a8._2_2_ = (ushort)(uVar92 >> 0x10);
  local_9a8._4_2_ = (ushort)(uVar92 >> 0x20);
  uStack_9a0._0_2_ = (ushort)uVar96;
  uStack_9a0._2_2_ = (ushort)(uVar96 >> 0x10);
  uStack_9a0._4_2_ = (ushort)(uVar96 >> 0x20);
  local_1008 = CONCAT26((ushort)(uVar92 >> 0x31),
                        CONCAT24(local_9a8._4_2_ >> 1,
                                 CONCAT22(local_9a8._2_2_ >> 1,(ushort)local_9a8 >> 1)));
  uStack_1000 = CONCAT26((ushort)(uVar96 >> 0x31),
                         CONCAT24(uStack_9a0._4_2_ >> 1,
                                  CONCAT22(uStack_9a0._2_2_ >> 1,(ushort)uStack_9a0 >> 1)));
  local_a48 = local_ff8._0_8_;
  uStack_a40 = local_ff8._8_8_;
  local_a58 = local_1008;
  uStack_a50 = uStack_1000;
  auVar94._8_8_ = uStack_1000;
  auVar94._0_8_ = local_1008;
  local_7e8 = paddusb(local_ff8,auVar94);
  local_7f8 = local_ea8;
  uStack_7f0 = uStack_ea0;
  auVar49._8_8_ = uStack_ea0;
  auVar49._0_8_ = local_ea8;
  auVar94 = psubusb(local_7e8,auVar49);
  local_ed8 = auVar94._0_8_;
  uStack_ed0 = auVar94._8_8_;
  local_b48 = local_ed8;
  uVar75 = local_b48;
  uStack_b40 = uStack_ed0;
  uVar76 = uStack_b40;
  local_b58 = local_e88;
  uVar73 = local_b58;
  uStack_b50 = uStack_e80;
  uVar74 = uStack_b50;
  local_b48._0_1_ = auVar94[0];
  local_b48._1_1_ = auVar94[1];
  local_b48._2_1_ = auVar94[2];
  local_b48._3_1_ = auVar94[3];
  local_b48._4_1_ = auVar94[4];
  local_b48._5_1_ = auVar94[5];
  local_b48._6_1_ = auVar94[6];
  local_b48._7_1_ = auVar94[7];
  uStack_b40._0_1_ = auVar94[8];
  uStack_b40._1_1_ = auVar94[9];
  uStack_b40._2_1_ = auVar94[10];
  uStack_b40._3_1_ = auVar94[0xb];
  uStack_b40._4_1_ = auVar94[0xc];
  uStack_b40._5_1_ = auVar94[0xd];
  uStack_b40._6_1_ = auVar94[0xe];
  uStack_b40._7_1_ = auVar94[0xf];
  local_b58._0_1_ = (char)local_e88;
  local_b58._1_1_ = (char)((ulong)local_e88 >> 8);
  local_b58._2_1_ = (char)((ulong)local_e88 >> 0x10);
  local_b58._3_1_ = (char)((ulong)local_e88 >> 0x18);
  local_b58._4_1_ = (char)((ulong)local_e88 >> 0x20);
  local_b58._5_1_ = (char)((ulong)local_e88 >> 0x28);
  local_b58._6_1_ = (char)((ulong)local_e88 >> 0x30);
  local_b58._7_1_ = (char)((ulong)local_e88 >> 0x38);
  uStack_b50._0_1_ = (char)uStack_e80;
  uStack_b50._1_1_ = (char)((ulong)uStack_e80 >> 8);
  uStack_b50._2_1_ = (char)((ulong)uStack_e80 >> 0x10);
  uStack_b50._3_1_ = (char)((ulong)uStack_e80 >> 0x18);
  uStack_b50._4_1_ = (char)((ulong)uStack_e80 >> 0x20);
  uStack_b50._5_1_ = (char)((ulong)uStack_e80 >> 0x28);
  uStack_b50._6_1_ = (char)((ulong)uStack_e80 >> 0x30);
  uStack_b50._7_1_ = (char)((ulong)uStack_e80 >> 0x38);
  local_6a8 = -((char)local_b48 == (char)local_b58);
  cStack_6a7 = -(local_b48._1_1_ == local_b58._1_1_);
  cStack_6a6 = -(local_b48._2_1_ == local_b58._2_1_);
  cStack_6a5 = -(local_b48._3_1_ == local_b58._3_1_);
  cStack_6a4 = -(local_b48._4_1_ == local_b58._4_1_);
  cStack_6a3 = -(local_b48._5_1_ == local_b58._5_1_);
  cStack_6a2 = -(local_b48._6_1_ == local_b58._6_1_);
  cStack_6a1 = -(local_b48._7_1_ == local_b58._7_1_);
  cStack_6a0 = -((char)uStack_b40 == (char)uStack_b50);
  cStack_69f = -(uStack_b40._1_1_ == uStack_b50._1_1_);
  cStack_69e = -(uStack_b40._2_1_ == uStack_b50._2_1_);
  cStack_69d = -(uStack_b40._3_1_ == uStack_b50._3_1_);
  cStack_69c = -(uStack_b40._4_1_ == uStack_b50._4_1_);
  cStack_69b = -(uStack_b40._5_1_ == uStack_b50._5_1_);
  cStack_69a = -(uStack_b40._6_1_ == uStack_b50._6_1_);
  cStack_699 = -(uStack_b40._7_1_ == uStack_b50._7_1_);
  local_6b8 = CONCAT17(uStack_fe1,
                       CONCAT16(uStack_fe2,
                                CONCAT15(uStack_fe3,
                                         CONCAT14(uStack_fe4,
                                                  CONCAT13(uStack_fe5,
                                                           CONCAT12(uStack_fe6,
                                                                    CONCAT11(uStack_fe7,local_fe8)))
                                                 ))));
  uStack_6b0 = CONCAT17(uStack_fd9,
                        CONCAT16(uStack_fda,
                                 CONCAT15(uStack_fdb,
                                          CONCAT14(uStack_fdc,
                                                   CONCAT13(uStack_fdd,
                                                            CONCAT12(uStack_fde,
                                                                     CONCAT11(uStack_fdf,uStack_fe0)
                                                                    ))))));
  uVar93 = CONCAT17(cStack_6a1,
                    CONCAT16(cStack_6a2,
                             CONCAT15(cStack_6a3,
                                      CONCAT14(cStack_6a4,
                                               CONCAT13(cStack_6a5,
                                                        CONCAT12(cStack_6a6,
                                                                 CONCAT11(cStack_6a7,local_6a8))))))
                   ) ^ local_6b8;
  uVar97 = CONCAT17(cStack_699,
                    CONCAT16(cStack_69a,
                             CONCAT15(cStack_69b,
                                      CONCAT14(cStack_69c,
                                               CONCAT13(cStack_69d,
                                                        CONCAT12(cStack_69e,
                                                                 CONCAT11(cStack_69f,cStack_6a0)))))
                            )) ^ uStack_6b0;
  local_a88 = CONCAT17(bStack_fa1,
                       CONCAT16(bStack_fa2,
                                CONCAT15(bStack_fa3,
                                         CONCAT14(bStack_fa4,
                                                  CONCAT13(bStack_fa5,
                                                           CONCAT12(bStack_fa6,
                                                                    CONCAT11(bStack_fa7,local_fa8)))
                                                 ))));
  uStack_a80 = CONCAT17(bStack_f99,
                        CONCAT16(bStack_f9a,
                                 CONCAT15(bStack_f9b,
                                          CONCAT14(bStack_f9c,
                                                   CONCAT13(bStack_f9d,
                                                            CONCAT12(bStack_f9e,
                                                                     CONCAT11(bStack_f9f,bStack_fa0)
                                                                    ))))));
  local_a98._0_1_ = (byte)uVar93;
  local_a98._1_1_ = (byte)(uVar93 >> 8);
  local_a98._2_1_ = (byte)(uVar93 >> 0x10);
  local_a98._3_1_ = (byte)(uVar93 >> 0x18);
  local_a98._4_1_ = (byte)(uVar93 >> 0x20);
  local_a98._5_1_ = (byte)(uVar93 >> 0x28);
  local_a98._6_1_ = (byte)(uVar93 >> 0x30);
  local_a98._7_1_ = (byte)(uVar93 >> 0x38);
  uStack_a90._0_1_ = (byte)uVar97;
  uStack_a90._1_1_ = (byte)(uVar97 >> 8);
  uStack_a90._2_1_ = (byte)(uVar97 >> 0x10);
  uStack_a90._3_1_ = (byte)(uVar97 >> 0x18);
  uStack_a90._4_1_ = (byte)(uVar97 >> 0x20);
  uStack_a90._5_1_ = (byte)(uVar97 >> 0x28);
  uStack_a90._6_1_ = (byte)(uVar97 >> 0x30);
  uStack_a90._7_1_ = (byte)(uVar97 >> 0x38);
  local_ed8._1_1_ =
       (bStack_fa7 < local_a98._1_1_) * local_a98._1_1_ |
       (bStack_fa7 >= local_a98._1_1_) * bStack_fa7;
  local_ed8._0_1_ =
       (local_fa8 < (byte)local_a98) * (byte)local_a98 | (local_fa8 >= (byte)local_a98) * local_fa8;
  local_ed8._2_1_ =
       (bStack_fa6 < local_a98._2_1_) * local_a98._2_1_ |
       (bStack_fa6 >= local_a98._2_1_) * bStack_fa6;
  local_ed8._3_1_ =
       (bStack_fa5 < local_a98._3_1_) * local_a98._3_1_ |
       (bStack_fa5 >= local_a98._3_1_) * bStack_fa5;
  local_ed8._4_1_ =
       (bStack_fa4 < local_a98._4_1_) * local_a98._4_1_ |
       (bStack_fa4 >= local_a98._4_1_) * bStack_fa4;
  local_ed8._5_1_ =
       (bStack_fa3 < local_a98._5_1_) * local_a98._5_1_ |
       (bStack_fa3 >= local_a98._5_1_) * bStack_fa3;
  local_ed8._6_1_ =
       (bStack_fa2 < local_a98._6_1_) * local_a98._6_1_ |
       (bStack_fa2 >= local_a98._6_1_) * bStack_fa2;
  local_ed8._7_1_ =
       (bStack_fa1 < local_a98._7_1_) * local_a98._7_1_ |
       (bStack_fa1 >= local_a98._7_1_) * bStack_fa1;
  uStack_ed0._0_1_ =
       (bStack_fa0 < (byte)uStack_a90) * (byte)uStack_a90 |
       (bStack_fa0 >= (byte)uStack_a90) * bStack_fa0;
  uStack_ed0._1_1_ =
       (bStack_f9f < uStack_a90._1_1_) * uStack_a90._1_1_ |
       (bStack_f9f >= uStack_a90._1_1_) * bStack_f9f;
  uStack_ed0._2_1_ =
       (bStack_f9e < uStack_a90._2_1_) * uStack_a90._2_1_ |
       (bStack_f9e >= uStack_a90._2_1_) * bStack_f9e;
  uStack_ed0._3_1_ =
       (bStack_f9d < uStack_a90._3_1_) * uStack_a90._3_1_ |
       (bStack_f9d >= uStack_a90._3_1_) * bStack_f9d;
  uStack_ed0._4_1_ =
       (bStack_f9c < uStack_a90._4_1_) * uStack_a90._4_1_ |
       (bStack_f9c >= uStack_a90._4_1_) * bStack_f9c;
  uStack_ed0._5_1_ =
       (bStack_f9b < uStack_a90._5_1_) * uStack_a90._5_1_ |
       (bStack_f9b >= uStack_a90._5_1_) * bStack_f9b;
  uStack_ed0._6_1_ =
       (bStack_f9a < uStack_a90._6_1_) * uStack_a90._6_1_ |
       (bStack_f9a >= uStack_a90._6_1_) * bStack_f9a;
  uStack_ed0._7_1_ =
       (bStack_f99 < uStack_a90._7_1_) * uStack_a90._7_1_ |
       (bStack_f99 >= uStack_a90._7_1_) * bStack_f99;
  a_02[1] = in_RSI;
  a_02[0] = (longlong)in_RDI;
  b_03[1] = b[1];
  local_b58 = uVar73;
  uStack_b50 = uVar74;
  local_b48 = uVar75;
  uStack_b40 = uVar76;
  local_a98 = uVar93;
  uStack_a90 = uVar97;
  local_a78 = uVar79;
  uStack_a70 = uVar80;
  local_a68 = uVar81;
  uStack_a60 = uVar82;
  local_9a8 = uVar92;
  uStack_9a0 = uVar96;
  alVar98 = abs_diff(a_02,b_03);
  b_04[0] = alVar98[1];
  a_03[1] = in_RSI;
  a_03[0] = (longlong)in_RDI;
  b_04[1] = b[1];
  alVar98 = abs_diff(a_03,b_04);
  b_05[0] = alVar98[1];
  local_aa8 = (byte)extraout_XMM0_Qa_03;
  bStack_aa7 = (byte)((ulong)extraout_XMM0_Qa_03 >> 8);
  bStack_aa6 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x10);
  bStack_aa5 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x18);
  bStack_aa4 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x20);
  bStack_aa3 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x28);
  bStack_aa2 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x30);
  bStack_aa1 = (byte)((ulong)extraout_XMM0_Qa_03 >> 0x38);
  bStack_aa0 = (byte)extraout_XMM0_Qb_03;
  bStack_a9f = (byte)((ulong)extraout_XMM0_Qb_03 >> 8);
  bStack_a9e = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x10);
  bStack_a9d = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x18);
  bStack_a9c = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x20);
  bStack_a9b = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x28);
  bStack_a9a = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x30);
  bStack_a99 = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x38);
  local_ab8 = (byte)extraout_XMM0_Qa_04;
  bStack_ab7 = (byte)((ulong)extraout_XMM0_Qa_04 >> 8);
  bStack_ab6 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x10);
  bStack_ab5 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x18);
  bStack_ab4 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x20);
  bStack_ab3 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x28);
  bStack_ab2 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x30);
  bStack_ab1 = (byte)((ulong)extraout_XMM0_Qa_04 >> 0x38);
  bStack_ab0 = (byte)extraout_XMM0_Qb_04;
  bStack_aaf = (byte)((ulong)extraout_XMM0_Qb_04 >> 8);
  bStack_aae = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x10);
  bStack_aad = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x18);
  bStack_aac = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x20);
  bStack_aab = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x28);
  bStack_aaa = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x30);
  bStack_aa9 = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x38);
  local_1018 = (local_aa8 < local_ab8) * local_ab8 | (local_aa8 >= local_ab8) * local_aa8;
  bStack_1017 = (bStack_aa7 < bStack_ab7) * bStack_ab7 | (bStack_aa7 >= bStack_ab7) * bStack_aa7;
  bStack_1016 = (bStack_aa6 < bStack_ab6) * bStack_ab6 | (bStack_aa6 >= bStack_ab6) * bStack_aa6;
  bStack_1015 = (bStack_aa5 < bStack_ab5) * bStack_ab5 | (bStack_aa5 >= bStack_ab5) * bStack_aa5;
  bStack_1014 = (bStack_aa4 < bStack_ab4) * bStack_ab4 | (bStack_aa4 >= bStack_ab4) * bStack_aa4;
  bStack_1013 = (bStack_aa3 < bStack_ab3) * bStack_ab3 | (bStack_aa3 >= bStack_ab3) * bStack_aa3;
  bStack_1012 = (bStack_aa2 < bStack_ab2) * bStack_ab2 | (bStack_aa2 >= bStack_ab2) * bStack_aa2;
  bStack_1011 = (bStack_aa1 < bStack_ab1) * bStack_ab1 | (bStack_aa1 >= bStack_ab1) * bStack_aa1;
  bStack_1010 = (bStack_aa0 < bStack_ab0) * bStack_ab0 | (bStack_aa0 >= bStack_ab0) * bStack_aa0;
  bStack_100f = (bStack_a9f < bStack_aaf) * bStack_aaf | (bStack_a9f >= bStack_aaf) * bStack_a9f;
  bStack_100e = (bStack_a9e < bStack_aae) * bStack_aae | (bStack_a9e >= bStack_aae) * bStack_a9e;
  bStack_100d = (bStack_a9d < bStack_aad) * bStack_aad | (bStack_a9d >= bStack_aad) * bStack_a9d;
  bStack_100c = (bStack_a9c < bStack_aac) * bStack_aac | (bStack_a9c >= bStack_aac) * bStack_a9c;
  bStack_100b = (bStack_a9b < bStack_aab) * bStack_aab | (bStack_a9b >= bStack_aab) * bStack_a9b;
  bStack_100a = (bStack_a9a < bStack_aaa) * bStack_aaa | (bStack_a9a >= bStack_aaa) * bStack_a9a;
  bStack_1009 = (bStack_a99 < bStack_aa9) * bStack_aa9 | (bStack_a99 >= bStack_aa9) * bStack_a99;
  local_ac8 = CONCAT17(bStack_1011,
                       CONCAT16(bStack_1012,
                                CONCAT15(bStack_1013,
                                         CONCAT14(bStack_1014,
                                                  CONCAT13(bStack_1015,
                                                           CONCAT12(bStack_1016,
                                                                    CONCAT11(bStack_1017,local_1018)
                                                                   ))))));
  uStack_ac0 = CONCAT17(bStack_1009,
                        CONCAT16(bStack_100a,
                                 CONCAT15(bStack_100b,
                                          CONCAT14(bStack_100c,
                                                   CONCAT13(bStack_100d,
                                                            CONCAT12(bStack_100e,
                                                                     CONCAT11(bStack_100f,
                                                                              bStack_1010)))))));
  local_ad8 = local_ed8;
  uVar79 = local_ad8;
  uStack_ad0 = uStack_ed0;
  uVar80 = uStack_ad0;
  local_ad8._0_1_ = (byte)local_ed8;
  local_ad8._1_1_ = local_ed8._1_1_;
  local_ad8._2_1_ = local_ed8._2_1_;
  local_ad8._3_1_ = local_ed8._3_1_;
  local_ad8._4_1_ = local_ed8._4_1_;
  local_ad8._5_1_ = local_ed8._5_1_;
  local_ad8._6_1_ = local_ed8._6_1_;
  local_ad8._7_1_ = local_ed8._7_1_;
  uStack_ad0._0_1_ = local_ed8._8_1_;
  uStack_ad0._1_1_ = local_ed8._9_1_;
  uStack_ad0._2_1_ = local_ed8._10_1_;
  uStack_ad0._3_1_ = local_ed8._11_1_;
  uStack_ad0._4_1_ = local_ed8._12_1_;
  uStack_ad0._5_1_ = local_ed8._13_1_;
  uStack_ad0._6_1_ = local_ed8._14_1_;
  uStack_ad0._7_1_ = local_ed8._15_1_;
  local_ed8._0_2_ =
       CONCAT11((bStack_1017 < local_ad8._1_1_) * local_ad8._1_1_ |
                (bStack_1017 >= local_ad8._1_1_) * bStack_1017,
                (local_1018 < (byte)local_ad8) * (byte)local_ad8 |
                (local_1018 >= (byte)local_ad8) * local_1018);
  local_ed8._0_3_ =
       CONCAT12((bStack_1016 < local_ad8._2_1_) * local_ad8._2_1_ |
                (bStack_1016 >= local_ad8._2_1_) * bStack_1016,(undefined2)local_ed8);
  local_ed8._0_4_ =
       CONCAT13((bStack_1015 < local_ad8._3_1_) * local_ad8._3_1_ |
                (bStack_1015 >= local_ad8._3_1_) * bStack_1015,(undefined3)local_ed8);
  local_ed8._0_5_ =
       CONCAT14((bStack_1014 < local_ad8._4_1_) * local_ad8._4_1_ |
                (bStack_1014 >= local_ad8._4_1_) * bStack_1014,(undefined4)local_ed8);
  local_ed8._0_6_ =
       CONCAT15((bStack_1013 < local_ad8._5_1_) * local_ad8._5_1_ |
                (bStack_1013 >= local_ad8._5_1_) * bStack_1013,(undefined5)local_ed8);
  local_ed8._0_7_ =
       CONCAT16((bStack_1012 < local_ad8._6_1_) * local_ad8._6_1_ |
                (bStack_1012 >= local_ad8._6_1_) * bStack_1012,(undefined6)local_ed8);
  local_ed8 = CONCAT17((bStack_1011 < local_ad8._7_1_) * local_ad8._7_1_ |
                       (bStack_1011 >= local_ad8._7_1_) * bStack_1011,(undefined7)local_ed8);
  uStack_ed0._0_1_ =
       (bStack_1010 < (byte)uStack_ad0) * (byte)uStack_ad0 |
       (bStack_1010 >= (byte)uStack_ad0) * bStack_1010;
  uStack_ed0._1_1_ =
       (bStack_100f < uStack_ad0._1_1_) * uStack_ad0._1_1_ |
       (bStack_100f >= uStack_ad0._1_1_) * bStack_100f;
  uStack_ed0._2_1_ =
       (bStack_100e < uStack_ad0._2_1_) * uStack_ad0._2_1_ |
       (bStack_100e >= uStack_ad0._2_1_) * bStack_100e;
  uStack_ed0._3_1_ =
       (bStack_100d < uStack_ad0._3_1_) * uStack_ad0._3_1_ |
       (bStack_100d >= uStack_ad0._3_1_) * bStack_100d;
  uStack_ed0._4_1_ =
       (bStack_100c < uStack_ad0._4_1_) * uStack_ad0._4_1_ |
       (bStack_100c >= uStack_ad0._4_1_) * bStack_100c;
  uStack_ed0._5_1_ =
       (bStack_100b < uStack_ad0._5_1_) * uStack_ad0._5_1_ |
       (bStack_100b >= uStack_ad0._5_1_) * bStack_100b;
  uStack_ed0._6_1_ =
       (bStack_100a < uStack_ad0._6_1_) * uStack_ad0._6_1_ |
       (bStack_100a >= uStack_ad0._6_1_) * bStack_100a;
  uStack_ed0._7_1_ =
       (bStack_1009 < uStack_ad0._7_1_) * uStack_ad0._7_1_ |
       (bStack_1009 >= uStack_ad0._7_1_) * bStack_1009;
  local_808 = local_ed8;
  uStack_800 = uStack_ed0;
  local_818 = local_eb8;
  uStack_810 = uStack_eb0;
  auVar48._8_8_ = uStack_ed0;
  auVar48._0_8_ = local_ed8;
  auVar47._8_8_ = uStack_eb0;
  auVar47._0_8_ = local_eb8;
  auVar94 = psubusb(auVar48,auVar47);
  local_ed8 = auVar94._0_8_;
  uStack_ed0 = auVar94._8_8_;
  local_b68 = local_ed8;
  uVar75 = local_b68;
  uStack_b60 = uStack_ed0;
  uVar76 = uStack_b60;
  local_b78 = local_e88;
  uVar73 = local_b78;
  uStack_b70 = uStack_e80;
  uVar74 = uStack_b70;
  local_b68._0_1_ = auVar94[0];
  local_b68._1_1_ = auVar94[1];
  local_b68._2_1_ = auVar94[2];
  local_b68._3_1_ = auVar94[3];
  local_b68._4_1_ = auVar94[4];
  local_b68._5_1_ = auVar94[5];
  local_b68._6_1_ = auVar94[6];
  local_b68._7_1_ = auVar94[7];
  uStack_b60._0_1_ = auVar94[8];
  uStack_b60._1_1_ = auVar94[9];
  uStack_b60._2_1_ = auVar94[10];
  uStack_b60._3_1_ = auVar94[0xb];
  uStack_b60._4_1_ = auVar94[0xc];
  uStack_b60._5_1_ = auVar94[0xd];
  uStack_b60._6_1_ = auVar94[0xe];
  uStack_b60._7_1_ = auVar94[0xf];
  local_b78._0_1_ = (char)local_e88;
  local_b78._1_1_ = (char)((ulong)local_e88 >> 8);
  local_b78._2_1_ = (char)((ulong)local_e88 >> 0x10);
  local_b78._3_1_ = (char)((ulong)local_e88 >> 0x18);
  local_b78._4_1_ = (char)((ulong)local_e88 >> 0x20);
  local_b78._5_1_ = (char)((ulong)local_e88 >> 0x28);
  local_b78._6_1_ = (char)((ulong)local_e88 >> 0x30);
  local_b78._7_1_ = (char)((ulong)local_e88 >> 0x38);
  uStack_b70._0_1_ = (char)uStack_e80;
  uStack_b70._1_1_ = (char)((ulong)uStack_e80 >> 8);
  uStack_b70._2_1_ = (char)((ulong)uStack_e80 >> 0x10);
  uStack_b70._3_1_ = (char)((ulong)uStack_e80 >> 0x18);
  uStack_b70._4_1_ = (char)((ulong)uStack_e80 >> 0x20);
  uStack_b70._5_1_ = (char)((ulong)uStack_e80 >> 0x28);
  uStack_b70._6_1_ = (char)((ulong)uStack_e80 >> 0x30);
  uStack_b70._7_1_ = (char)((ulong)uStack_e80 >> 0x38);
  local_ed8._0_2_ =
       CONCAT11(-(local_b68._1_1_ == local_b78._1_1_),-((char)local_b68 == (char)local_b78));
  local_ed8._0_3_ = CONCAT12(-(local_b68._2_1_ == local_b78._2_1_),(undefined2)local_ed8);
  local_ed8._0_4_ = CONCAT13(-(local_b68._3_1_ == local_b78._3_1_),(undefined3)local_ed8);
  local_ed8._0_5_ = CONCAT14(-(local_b68._4_1_ == local_b78._4_1_),(undefined4)local_ed8);
  local_ed8._0_6_ = CONCAT15(-(local_b68._5_1_ == local_b78._5_1_),(undefined5)local_ed8);
  local_ed8._0_7_ = CONCAT16(-(local_b68._6_1_ == local_b78._6_1_),(undefined6)local_ed8);
  local_ed8 = CONCAT17(-(local_b68._7_1_ == local_b78._7_1_),(undefined7)local_ed8);
  uStack_ed0._0_1_ = -((char)uStack_b60 == (char)uStack_b70);
  uStack_ed0._1_1_ = -(uStack_b60._1_1_ == uStack_b70._1_1_);
  uStack_ed0._2_1_ = -(uStack_b60._2_1_ == uStack_b70._2_1_);
  uStack_ed0._3_1_ = -(uStack_b60._3_1_ == uStack_b70._3_1_);
  uStack_ed0._4_1_ = -(uStack_b60._4_1_ == uStack_b70._4_1_);
  uStack_ed0._5_1_ = -(uStack_b60._5_1_ == uStack_b70._5_1_);
  uStack_ed0._6_1_ = -(uStack_b60._6_1_ == uStack_b70._6_1_);
  uStack_ed0._7_1_ = -(uStack_b60._7_1_ == uStack_b70._7_1_);
  local_b88 = local_ed8;
  uStack_b80 = uStack_ed0;
  local_b98 = local_e88;
  uStack_b90 = uStack_e80;
  local_688 = -(-((char)local_b68 == (char)local_b78) == (char)local_b78);
  cStack_687 = -(-(local_b68._1_1_ == local_b78._1_1_) == local_b78._1_1_);
  cStack_686 = -(-(local_b68._2_1_ == local_b78._2_1_) == local_b78._2_1_);
  cStack_685 = -(-(local_b68._3_1_ == local_b78._3_1_) == local_b78._3_1_);
  cStack_684 = -(-(local_b68._4_1_ == local_b78._4_1_) == local_b78._4_1_);
  cStack_683 = -(-(local_b68._5_1_ == local_b78._5_1_) == local_b78._5_1_);
  cStack_682 = -(-(local_b68._6_1_ == local_b78._6_1_) == local_b78._6_1_);
  cStack_681 = -(-(local_b68._7_1_ == local_b78._7_1_) == local_b78._7_1_);
  cStack_680 = -(-((char)uStack_b60 == (char)uStack_b70) == (char)uStack_b70);
  cStack_67f = -(-(uStack_b60._1_1_ == uStack_b70._1_1_) == uStack_b70._1_1_);
  cStack_67e = -(-(uStack_b60._2_1_ == uStack_b70._2_1_) == uStack_b70._2_1_);
  cStack_67d = -(-(uStack_b60._3_1_ == uStack_b70._3_1_) == uStack_b70._3_1_);
  cStack_67c = -(-(uStack_b60._4_1_ == uStack_b70._4_1_) == uStack_b70._4_1_);
  cStack_67b = -(-(uStack_b60._5_1_ == uStack_b70._5_1_) == uStack_b70._5_1_);
  cStack_67a = -(-(uStack_b60._6_1_ == uStack_b70._6_1_) == uStack_b70._6_1_);
  bStack_679 = -(-(uStack_b60._7_1_ == uStack_b70._7_1_) == uStack_b70._7_1_);
  auVar51[1] = cStack_687;
  auVar51[0] = local_688;
  auVar51[2] = cStack_686;
  auVar51[3] = cStack_685;
  auVar51[4] = cStack_684;
  auVar51[5] = cStack_683;
  auVar51[6] = cStack_682;
  auVar51[7] = cStack_681;
  auVar51[8] = cStack_680;
  auVar51[9] = cStack_67f;
  auVar51[10] = cStack_67e;
  auVar51[0xb] = cStack_67d;
  auVar51[0xc] = cStack_67c;
  auVar51[0xd] = cStack_67b;
  auVar51[0xe] = cStack_67a;
  auVar51[0xf] = bStack_679;
  uVar1 = (ushort)(SUB161(auVar51 >> 7,0) & 1) | (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
          (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
          (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
          (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
          (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
          (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
          (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe | (ushort)(bStack_679 >> 7) << 0xf;
  if (uVar1 != 0xffff) {
    a_04[1] = in_RSI;
    a_04[0] = (longlong)in_RDI;
    b_05[1]._0_2_ = uVar1;
    b_05[1]._2_6_ = 0;
    uVar92 = (ulong)uVar1;
    local_b78 = uVar73;
    uStack_b70 = uVar74;
    local_b68 = uVar75;
    uStack_b60 = uVar76;
    local_ad8 = uVar79;
    uStack_ad0 = uVar80;
    alVar98 = abs_diff(a_04,b_05);
    b_06[0] = alVar98[1];
    a_05[1] = in_RSI;
    a_05[0] = (longlong)in_RDI;
    b_06[1] = uVar92;
    abs_diff(a_05,b_06);
    local_ae8 = (byte)extraout_XMM0_Qa_05;
    bStack_ae7 = (byte)((ulong)extraout_XMM0_Qa_05 >> 8);
    bStack_ae6 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x10);
    bStack_ae5 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x18);
    bStack_ae4 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x20);
    bStack_ae3 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x28);
    bStack_ae2 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x30);
    bStack_ae1 = (byte)((ulong)extraout_XMM0_Qa_05 >> 0x38);
    bStack_ae0 = (byte)extraout_XMM0_Qb_05;
    bStack_adf = (byte)((ulong)extraout_XMM0_Qb_05 >> 8);
    bStack_ade = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x10);
    bStack_add = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x18);
    bStack_adc = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x20);
    bStack_adb = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x28);
    bStack_ada = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x30);
    bStack_ad9 = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x38);
    local_af8 = (byte)extraout_XMM0_Qa_06;
    bStack_af7 = (byte)((ulong)extraout_XMM0_Qa_06 >> 8);
    bStack_af6 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x10);
    bStack_af5 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x18);
    bStack_af4 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x20);
    bStack_af3 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x28);
    bStack_af2 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x30);
    bStack_af1 = (byte)((ulong)extraout_XMM0_Qa_06 >> 0x38);
    bStack_af0 = (byte)extraout_XMM0_Qb_06;
    bStack_aef = (byte)((ulong)extraout_XMM0_Qb_06 >> 8);
    bStack_aee = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x10);
    bStack_aed = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x18);
    bStack_aec = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x20);
    bStack_aeb = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x28);
    bStack_aea = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x30);
    bStack_ae9 = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x38);
    local_1028 = (local_ae8 < local_af8) * local_af8 | (local_ae8 >= local_af8) * local_ae8;
    bStack_1027 = (bStack_ae7 < bStack_af7) * bStack_af7 | (bStack_ae7 >= bStack_af7) * bStack_ae7;
    bStack_1026 = (bStack_ae6 < bStack_af6) * bStack_af6 | (bStack_ae6 >= bStack_af6) * bStack_ae6;
    bStack_1025 = (bStack_ae5 < bStack_af5) * bStack_af5 | (bStack_ae5 >= bStack_af5) * bStack_ae5;
    bStack_1024 = (bStack_ae4 < bStack_af4) * bStack_af4 | (bStack_ae4 >= bStack_af4) * bStack_ae4;
    bStack_1023 = (bStack_ae3 < bStack_af3) * bStack_af3 | (bStack_ae3 >= bStack_af3) * bStack_ae3;
    bStack_1022 = (bStack_ae2 < bStack_af2) * bStack_af2 | (bStack_ae2 >= bStack_af2) * bStack_ae2;
    bStack_1021 = (bStack_ae1 < bStack_af1) * bStack_af1 | (bStack_ae1 >= bStack_af1) * bStack_ae1;
    bStack_1020 = (bStack_ae0 < bStack_af0) * bStack_af0 | (bStack_ae0 >= bStack_af0) * bStack_ae0;
    bStack_101f = (bStack_adf < bStack_aef) * bStack_aef | (bStack_adf >= bStack_aef) * bStack_adf;
    bStack_101e = (bStack_ade < bStack_aee) * bStack_aee | (bStack_ade >= bStack_aee) * bStack_ade;
    bStack_101d = (bStack_add < bStack_aed) * bStack_aed | (bStack_add >= bStack_aed) * bStack_add;
    bStack_101c = (bStack_adc < bStack_aec) * bStack_aec | (bStack_adc >= bStack_aec) * bStack_adc;
    bStack_101b = (bStack_adb < bStack_aeb) * bStack_aeb | (bStack_adb >= bStack_aeb) * bStack_adb;
    bStack_101a = (bStack_ada < bStack_aea) * bStack_aea | (bStack_ada >= bStack_aea) * bStack_ada;
    bStack_1019 = (bStack_ad9 < bStack_ae9) * bStack_ae9 | (bStack_ad9 >= bStack_ae9) * bStack_ad9;
    local_b08 = CONCAT17(bStack_1021,
                         CONCAT16(bStack_1022,
                                  CONCAT15(bStack_1023,
                                           CONCAT14(bStack_1024,
                                                    CONCAT13(bStack_1025,
                                                             CONCAT12(bStack_1026,
                                                                      CONCAT11(bStack_1027,
                                                                               local_1028)))))));
    uStack_b00 = CONCAT17(bStack_1019,
                          CONCAT16(bStack_101a,
                                   CONCAT15(bStack_101b,
                                            CONCAT14(bStack_101c,
                                                     CONCAT13(bStack_101d,
                                                              CONCAT12(bStack_101e,
                                                                       CONCAT11(bStack_101f,
                                                                                bStack_1020)))))));
    local_b18 = CONCAT17(bStack_fa1,
                         CONCAT16(bStack_fa2,
                                  CONCAT15(bStack_fa3,
                                           CONCAT14(bStack_fa4,
                                                    CONCAT13(bStack_fa5,
                                                             CONCAT12(bStack_fa6,
                                                                      CONCAT11(bStack_fa7,local_fa8)
                                                                     ))))));
    uStack_b10 = CONCAT17(bStack_f99,
                          CONCAT16(bStack_f9a,
                                   CONCAT15(bStack_f9b,
                                            CONCAT14(bStack_f9c,
                                                     CONCAT13(bStack_f9d,
                                                              CONCAT12(bStack_f9e,
                                                                       CONCAT11(bStack_f9f,
                                                                                bStack_fa0)))))));
    local_ef8._0_2_ =
         CONCAT11((bStack_1027 < bStack_fa7) * bStack_fa7 |
                  (bStack_1027 >= bStack_fa7) * bStack_1027,
                  (local_1028 < local_fa8) * local_fa8 | (local_1028 >= local_fa8) * local_1028);
    local_ef8._0_3_ =
         CONCAT12((bStack_1026 < bStack_fa6) * bStack_fa6 |
                  (bStack_1026 >= bStack_fa6) * bStack_1026,(undefined2)local_ef8);
    local_ef8._0_4_ =
         CONCAT13((bStack_1025 < bStack_fa5) * bStack_fa5 |
                  (bStack_1025 >= bStack_fa5) * bStack_1025,(undefined3)local_ef8);
    local_ef8._0_5_ =
         CONCAT14((bStack_1024 < bStack_fa4) * bStack_fa4 |
                  (bStack_1024 >= bStack_fa4) * bStack_1024,(undefined4)local_ef8);
    local_ef8._0_6_ =
         CONCAT15((bStack_1023 < bStack_fa3) * bStack_fa3 |
                  (bStack_1023 >= bStack_fa3) * bStack_1023,(undefined5)local_ef8);
    local_ef8._0_7_ =
         CONCAT16((bStack_1022 < bStack_fa2) * bStack_fa2 |
                  (bStack_1022 >= bStack_fa2) * bStack_1022,(undefined6)local_ef8);
    local_ef8 = CONCAT17((bStack_1021 < bStack_fa1) * bStack_fa1 |
                         (bStack_1021 >= bStack_fa1) * bStack_1021,(undefined7)local_ef8);
    uStack_ef0._0_1_ =
         (bStack_1020 < bStack_fa0) * bStack_fa0 | (bStack_1020 >= bStack_fa0) * bStack_1020;
    uStack_ef0._1_1_ =
         (bStack_101f < bStack_f9f) * bStack_f9f | (bStack_101f >= bStack_f9f) * bStack_101f;
    uStack_ef0._2_1_ =
         (bStack_101e < bStack_f9e) * bStack_f9e | (bStack_101e >= bStack_f9e) * bStack_101e;
    uStack_ef0._3_1_ =
         (bStack_101d < bStack_f9d) * bStack_f9d | (bStack_101d >= bStack_f9d) * bStack_101d;
    uStack_ef0._4_1_ =
         (bStack_101c < bStack_f9c) * bStack_f9c | (bStack_101c >= bStack_f9c) * bStack_101c;
    uStack_ef0._5_1_ =
         (bStack_101b < bStack_f9b) * bStack_f9b | (bStack_101b >= bStack_f9b) * bStack_101b;
    uStack_ef0._6_1_ =
         (bStack_101a < bStack_f9a) * bStack_f9a | (bStack_101a >= bStack_f9a) * bStack_101a;
    uStack_ef0._7_1_ =
         (bStack_1019 < bStack_f99) * bStack_f99 | (bStack_1019 >= bStack_f99) * bStack_1019;
    local_828 = local_ef8;
    lStack_820 = uStack_ef0;
    local_838 = local_e98;
    uStack_830 = uStack_e90;
    auVar46._8_8_ = uStack_ef0;
    auVar46._0_8_ = local_ef8;
    auVar45._8_8_ = uStack_e90;
    auVar45._0_8_ = local_e98;
    auVar94 = psubusb(auVar46,auVar45);
    local_ef8 = auVar94._0_8_;
    uStack_ef0 = auVar94._8_8_;
    local_ba8 = local_ef8;
    lVar77 = local_ba8;
    uStack_ba0 = uStack_ef0;
    lVar78 = uStack_ba0;
    local_bb8 = local_e88;
    uVar75 = local_bb8;
    uStack_bb0 = uStack_e80;
    uVar76 = uStack_bb0;
    local_ba8._0_1_ = auVar94[0];
    local_ba8._1_1_ = auVar94[1];
    local_ba8._2_1_ = auVar94[2];
    local_ba8._3_1_ = auVar94[3];
    local_ba8._4_1_ = auVar94[4];
    local_ba8._5_1_ = auVar94[5];
    local_ba8._6_1_ = auVar94[6];
    local_ba8._7_1_ = auVar94[7];
    uStack_ba0._0_1_ = auVar94[8];
    uStack_ba0._1_1_ = auVar94[9];
    uStack_ba0._2_1_ = auVar94[10];
    uStack_ba0._3_1_ = auVar94[0xb];
    uStack_ba0._4_1_ = auVar94[0xc];
    uStack_ba0._5_1_ = auVar94[0xd];
    uStack_ba0._6_1_ = auVar94[0xe];
    uStack_ba0._7_1_ = auVar94[0xf];
    local_bb8._0_1_ = (char)local_e88;
    local_bb8._1_1_ = (char)((ulong)local_e88 >> 8);
    local_bb8._2_1_ = (char)((ulong)local_e88 >> 0x10);
    local_bb8._3_1_ = (char)((ulong)local_e88 >> 0x18);
    local_bb8._4_1_ = (char)((ulong)local_e88 >> 0x20);
    local_bb8._5_1_ = (char)((ulong)local_e88 >> 0x28);
    local_bb8._6_1_ = (char)((ulong)local_e88 >> 0x30);
    local_bb8._7_1_ = (char)((ulong)local_e88 >> 0x38);
    uStack_bb0._0_1_ = (char)uStack_e80;
    uStack_bb0._1_1_ = (char)((ulong)uStack_e80 >> 8);
    uStack_bb0._2_1_ = (char)((ulong)uStack_e80 >> 0x10);
    uStack_bb0._3_1_ = (char)((ulong)uStack_e80 >> 0x18);
    uStack_bb0._4_1_ = (char)((ulong)uStack_e80 >> 0x20);
    uStack_bb0._5_1_ = (char)((ulong)uStack_e80 >> 0x28);
    uStack_bb0._6_1_ = (char)((ulong)uStack_e80 >> 0x30);
    uStack_bb0._7_1_ = (char)((ulong)uStack_e80 >> 0x38);
    local_ef8._0_2_ =
         CONCAT11(-(local_ba8._1_1_ == local_bb8._1_1_),-((char)local_ba8 == (char)local_bb8));
    local_ef8._0_3_ = CONCAT12(-(local_ba8._2_1_ == local_bb8._2_1_),(undefined2)local_ef8);
    local_ef8._0_4_ = CONCAT13(-(local_ba8._3_1_ == local_bb8._3_1_),(undefined3)local_ef8);
    local_ef8._0_5_ = CONCAT14(-(local_ba8._4_1_ == local_bb8._4_1_),(undefined4)local_ef8);
    local_ef8._0_6_ = CONCAT15(-(local_ba8._5_1_ == local_bb8._5_1_),(undefined5)local_ef8);
    local_ef8._0_7_ = CONCAT16(-(local_ba8._6_1_ == local_bb8._6_1_),(undefined6)local_ef8);
    local_ef8 = CONCAT17(-(local_ba8._7_1_ == local_bb8._7_1_),(undefined7)local_ef8);
    uStack_ef0._0_1_ = -((char)uStack_ba0 == (char)uStack_bb0);
    uStack_ef0._1_1_ = -(uStack_ba0._1_1_ == uStack_bb0._1_1_);
    uStack_ef0._2_1_ = -(uStack_ba0._2_1_ == uStack_bb0._2_1_);
    uStack_ef0._3_1_ = -(uStack_ba0._3_1_ == uStack_bb0._3_1_);
    uStack_ef0._4_1_ = -(uStack_ba0._4_1_ == uStack_bb0._4_1_);
    uStack_ef0._5_1_ = -(uStack_ba0._5_1_ == uStack_bb0._5_1_);
    uStack_ef0._6_1_ = -(uStack_ba0._6_1_ == uStack_bb0._6_1_);
    uStack_ef0._7_1_ = -(uStack_ba0._7_1_ == uStack_bb0._7_1_);
    local_888 = local_ef8;
    uStack_880 = uStack_ef0;
    local_898 = local_ed8;
    uStack_890 = uStack_ed0;
    local_ef8 = local_ef8 & local_ed8;
    uStack_ef0 = uStack_ef0 & uStack_ed0;
    local_c1b = 4;
    local_e9 = 4;
    local_ea = 4;
    local_eb = 4;
    local_ec = 4;
    local_ed = 4;
    local_ee = 4;
    local_ef = 4;
    local_f0 = 4;
    local_f1 = 4;
    local_f2 = 4;
    local_f3 = 4;
    local_f4 = 4;
    local_f5 = 4;
    local_f6 = 4;
    local_f7 = 4;
    local_f8 = 4;
    local_1038 = 0x404040404040404;
    uStack_1030 = 0x404040404040404;
    local_c1c = 3;
    local_c9 = 3;
    local_ca = 3;
    local_cb = 3;
    local_cc = 3;
    local_cd = 3;
    local_ce = 3;
    local_cf = 3;
    local_d0 = 3;
    local_d1 = 3;
    local_d2 = 3;
    local_d3 = 3;
    local_d4 = 3;
    local_d5 = 3;
    local_d6 = 3;
    local_d7 = 3;
    local_d8 = 3;
    local_1048 = 0x303030303030303;
    uStack_1040 = 0x303030303030303;
    local_c1d = 0x80;
    local_a9 = 0x80;
    local_aa = 0x80;
    local_ab = 0x80;
    local_ac = 0x80;
    local_ad = 0x80;
    local_ae = 0x80;
    local_af = 0x80;
    local_b0 = 0x80;
    local_b1 = 0x80;
    local_b2 = 0x80;
    local_b3 = 0x80;
    local_b4 = 0x80;
    local_b5 = 0x80;
    local_b6 = 0x80;
    local_b7 = 0x80;
    local_b8 = 0x80;
    local_1058 = 0x8080808080808080;
    uStack_1050 = 0x8080808080808080;
    local_c1e = 0xe0;
    local_89 = 0xe0;
    local_8a = 0xe0;
    local_8b = 0xe0;
    local_8c = 0xe0;
    local_8d = 0xe0;
    local_8e = 0xe0;
    local_8f = 0xe0;
    local_90 = 0xe0;
    local_91 = 0xe0;
    local_92 = 0xe0;
    local_93 = 0xe0;
    local_94 = 0xe0;
    local_95 = 0xe0;
    local_96 = 0xe0;
    local_97 = 0xe0;
    local_98 = 0xe0;
    local_1068 = 0xe0e0e0e0e0e0e0e0;
    uStack_1060 = 0xe0e0e0e0e0e0e0e0;
    local_c1f = 0x1f;
    local_69 = 0x1f;
    local_6a = 0x1f;
    local_6b = 0x1f;
    local_6c = 0x1f;
    local_6d = 0x1f;
    local_6e = 0x1f;
    local_6f = 0x1f;
    local_70 = 0x1f;
    local_71 = 0x1f;
    local_72 = 0x1f;
    local_73 = 0x1f;
    local_74 = 0x1f;
    local_75 = 0x1f;
    local_76 = 0x1f;
    local_77 = 0x1f;
    local_78 = 0x1f;
    local_1078 = 0x1f1f1f1f1f1f1f1f;
    uStack_1070 = 0x1f1f1f1f1f1f1f1f;
    local_c20 = 1;
    local_49 = 1;
    local_4a = 1;
    local_4b = 1;
    local_4c = 1;
    local_4d = 1;
    local_4e = 1;
    local_4f = 1;
    local_50 = 1;
    local_51 = 1;
    local_52 = 1;
    local_53 = 1;
    local_54 = 1;
    local_55 = 1;
    local_56 = 1;
    local_57 = 1;
    local_58 = 1;
    local_1088 = 0x101010101010101;
    uStack_1080 = 0x101010101010101;
    local_c21 = 0x7f;
    local_29 = 0x7f;
    local_2a = 0x7f;
    local_2b = 0x7f;
    local_2c = 0x7f;
    local_2d = 0x7f;
    local_2e = 0x7f;
    local_2f = 0x7f;
    local_30 = 0x7f;
    local_31 = 0x7f;
    local_32 = 0x7f;
    local_33 = 0x7f;
    local_34 = 0x7f;
    local_35 = 0x7f;
    local_36 = 0x7f;
    local_37 = 0x7f;
    local_38 = 0x7f;
    local_1098 = 0x7f7f7f7f7f7f7f7f;
    uStack_1090 = 0x7f7f7f7f7f7f7f7f;
    local_10a8 = 0xff;
    uStack_10a7 = 0xff;
    uStack_10a6 = 0xff;
    uStack_10a5 = 0xff;
    uStack_10a4 = 0xff;
    uStack_10a3 = 0xff;
    uStack_10a2 = 0xff;
    uStack_10a1 = 0xff;
    uStack_10a0 = 0xff;
    uStack_109f = 0xff;
    uStack_109e = 0xff;
    uStack_109d = 0xff;
    uStack_109c = 0xff;
    uStack_109b = 0xff;
    uStack_109a = 0xff;
    uStack_1099 = 0xff;
    local_6c8 = local_f18;
    uStack_6c0 = uStack_f10;
    local_608 = local_f18 ^ 0x8080808080808080;
    uStack_600 = uStack_f10 ^ 0x8080808080808080;
    local_6e8 = local_f28;
    uStack_6e0 = uStack_f20;
    local_638 = local_f28 ^ 0x8080808080808080;
    uStack_630 = uStack_f20 ^ 0x8080808080808080;
    local_708 = local_f38;
    uStack_700 = uStack_f30;
    local_648 = local_f38 ^ 0x8080808080808080;
    uStack_640 = uStack_f30 ^ 0x8080808080808080;
    local_728 = local_f48;
    uStack_720 = uStack_f40;
    local_668 = local_f48 ^ 0x8080808080808080;
    uStack_660 = uStack_f40 ^ 0x8080808080808080;
    local_848 = CONCAT17(bStack_fa1,
                         CONCAT16(bStack_fa2,
                                  CONCAT15(bStack_fa3,
                                           CONCAT14(bStack_fa4,
                                                    CONCAT13(bStack_fa5,
                                                             CONCAT12(bStack_fa6,
                                                                      CONCAT11(bStack_fa7,local_fa8)
                                                                     ))))));
    uStack_840 = CONCAT17(bStack_f99,
                          CONCAT16(bStack_f9a,
                                   CONCAT15(bStack_f9b,
                                            CONCAT14(bStack_f9c,
                                                     CONCAT13(bStack_f9d,
                                                              CONCAT12(bStack_f9e,
                                                                       CONCAT11(bStack_f9f,
                                                                                bStack_fa0)))))));
    local_858 = local_ec8;
    uStack_850 = uStack_ec0;
    auVar44._8_8_ = uStack_840;
    auVar44._0_8_ = local_848;
    auVar43._8_8_ = uStack_ec0;
    auVar43._0_8_ = local_ec8;
    auVar94 = psubusb(auVar44,auVar43);
    local_ee8 = auVar94._0_8_;
    uStack_ee0 = auVar94._8_8_;
    local_be8 = local_ee8;
    uVar73 = local_be8;
    uStack_be0 = uStack_ee0;
    uVar74 = uStack_be0;
    local_bf8 = local_e88;
    uStack_bf0 = uStack_e80;
    local_be8._0_1_ = auVar94[0];
    local_be8._1_1_ = auVar94[1];
    local_be8._2_1_ = auVar94[2];
    local_be8._3_1_ = auVar94[3];
    local_be8._4_1_ = auVar94[4];
    local_be8._5_1_ = auVar94[5];
    local_be8._6_1_ = auVar94[6];
    local_be8._7_1_ = auVar94[7];
    uStack_be0._0_1_ = auVar94[8];
    uStack_be0._1_1_ = auVar94[9];
    uStack_be0._2_1_ = auVar94[10];
    uStack_be0._3_1_ = auVar94[0xb];
    uStack_be0._4_1_ = auVar94[0xc];
    uStack_be0._5_1_ = auVar94[0xd];
    uStack_be0._6_1_ = auVar94[0xe];
    uStack_be0._7_1_ = auVar94[0xf];
    local_748 = -((char)local_be8 == (char)local_bb8);
    cStack_747 = -(local_be8._1_1_ == local_bb8._1_1_);
    cStack_746 = -(local_be8._2_1_ == local_bb8._2_1_);
    cStack_745 = -(local_be8._3_1_ == local_bb8._3_1_);
    cStack_744 = -(local_be8._4_1_ == local_bb8._4_1_);
    cStack_743 = -(local_be8._5_1_ == local_bb8._5_1_);
    cStack_742 = -(local_be8._6_1_ == local_bb8._6_1_);
    cStack_741 = -(local_be8._7_1_ == local_bb8._7_1_);
    cStack_740 = -((char)uStack_be0 == (char)uStack_bb0);
    cStack_73f = -(uStack_be0._1_1_ == uStack_bb0._1_1_);
    cStack_73e = -(uStack_be0._2_1_ == uStack_bb0._2_1_);
    cStack_73d = -(uStack_be0._3_1_ == uStack_bb0._3_1_);
    cStack_73c = -(uStack_be0._4_1_ == uStack_bb0._4_1_);
    cStack_73b = -(uStack_be0._5_1_ == uStack_bb0._5_1_);
    cStack_73a = -(uStack_be0._6_1_ == uStack_bb0._6_1_);
    cStack_739 = -(uStack_be0._7_1_ == uStack_bb0._7_1_);
    local_758 = 0xffffffffffffffff;
    uStack_750 = 0xffffffffffffffff;
    local_8b8 = CONCAT17(cStack_741,
                         CONCAT16(cStack_742,
                                  CONCAT15(cStack_743,
                                           CONCAT14(cStack_744,
                                                    CONCAT13(cStack_745,
                                                             CONCAT12(cStack_746,
                                                                      CONCAT11(cStack_747,local_748)
                                                                     )))))) ^ 0xffffffffffffffff;
    uStack_8b0 = CONCAT17(cStack_739,
                          CONCAT16(cStack_73a,
                                   CONCAT15(cStack_73b,
                                            CONCAT14(cStack_73c,
                                                     CONCAT13(cStack_73d,
                                                              CONCAT12(cStack_73e,
                                                                       CONCAT11(cStack_73f,
                                                                                cStack_740))))))) ^
                 0xffffffffffffffff;
    uStack_ee0 = uStack_8b0;
    local_ee8 = local_8b8;
    auVar59._8_8_ = uStack_600;
    auVar59._0_8_ = local_608;
    auVar58._8_8_ = uStack_660;
    auVar58._0_8_ = local_668;
    local_8a8 = psubsb(auVar59,auVar58);
    local_508 = local_8a8._0_8_ & local_8b8;
    uStack_500 = local_8a8._8_8_ & uStack_8b0;
    auVar57._8_8_ = uStack_640;
    auVar57._0_8_ = local_648;
    auVar56._8_8_ = uStack_630;
    auVar56._0_8_ = local_638;
    auVar94 = psubsb(auVar57,auVar56);
    local_10c8 = auVar94._0_8_;
    uStack_10c0 = auVar94._8_8_;
    local_518 = local_10c8;
    uStack_510 = uStack_10c0;
    auVar70._8_8_ = uStack_500;
    auVar70._0_8_ = local_508;
    auVar95 = paddsb(auVar70,auVar94);
    local_10b8 = auVar95._0_8_;
    uStack_10b0 = auVar95._8_8_;
    local_528 = local_10b8;
    uStack_520 = uStack_10b0;
    local_538 = local_10c8;
    uStack_530 = uStack_10c0;
    auVar95 = paddsb(auVar95,auVar94);
    local_10b8 = auVar95._0_8_;
    uStack_10b0 = auVar95._8_8_;
    local_548 = local_10b8;
    uStack_540 = uStack_10b0;
    local_558 = local_10c8;
    uStack_550 = uStack_10c0;
    auVar94 = paddsb(auVar95,auVar94);
    local_10b8 = auVar94._0_8_;
    uStack_10b0 = auVar94._8_8_;
    local_8c8 = local_10b8;
    uStack_8c0 = uStack_10b0;
    local_8d8 = local_ed8;
    uStack_8d0 = uStack_ed0;
    local_588 = local_10b8 & local_ed8;
    uStack_580 = uStack_10b0 & uStack_ed0;
    auVar69._8_8_ = uStack_580;
    auVar69._0_8_ = local_588;
    auVar68._8_8_ = 0x404040404040404;
    auVar68._0_8_ = 0x404040404040404;
    auVar94 = paddsb(auVar69,auVar68);
    auVar67._8_8_ = uStack_580;
    auVar67._0_8_ = local_588;
    auVar66._8_8_ = 0x303030303030303;
    auVar66._0_8_ = 0x303030303030303;
    auVar95 = paddsb(auVar67,auVar66);
    local_10d8 = auVar94._0_8_;
    uStack_10d0 = auVar94._8_8_;
    local_4a8 = local_e88;
    uStack_4a0 = uStack_e80;
    local_4b8 = local_10d8;
    uVar83 = local_4b8;
    uStack_4b0 = uStack_10d0;
    uVar84 = uStack_4b0;
    local_4b8._0_1_ = auVar94[0];
    local_4b8._1_1_ = auVar94[1];
    local_4b8._2_1_ = auVar94[2];
    local_4b8._3_1_ = auVar94[3];
    local_4b8._4_1_ = auVar94[4];
    local_4b8._5_1_ = auVar94[5];
    local_4b8._6_1_ = auVar94[6];
    local_4b8._7_1_ = auVar94[7];
    uStack_4b0._0_1_ = auVar94[8];
    uStack_4b0._1_1_ = auVar94[9];
    uStack_4b0._2_1_ = auVar94[10];
    uStack_4b0._3_1_ = auVar94[0xb];
    uStack_4b0._4_1_ = auVar94[0xc];
    uStack_4b0._5_1_ = auVar94[0xd];
    uStack_4b0._6_1_ = auVar94[0xe];
    uStack_4b0._7_1_ = auVar94[0xf];
    local_10c8._0_2_ =
         CONCAT11(-(local_4b8._1_1_ < local_bb8._1_1_),-((char)local_4b8 < (char)local_bb8));
    local_10c8._0_3_ = CONCAT12(-(local_4b8._2_1_ < local_bb8._2_1_),(undefined2)local_10c8);
    local_10c8._0_4_ = CONCAT13(-(local_4b8._3_1_ < local_bb8._3_1_),(undefined3)local_10c8);
    local_10c8._0_5_ = CONCAT14(-(local_4b8._4_1_ < local_bb8._4_1_),(undefined4)local_10c8);
    local_10c8._0_6_ = CONCAT15(-(local_4b8._5_1_ < local_bb8._5_1_),(undefined5)local_10c8);
    local_10c8._0_7_ = CONCAT16(-(local_4b8._6_1_ < local_bb8._6_1_),(undefined6)local_10c8);
    local_10c8 = CONCAT17(-(local_4b8._7_1_ < local_bb8._7_1_),(undefined7)local_10c8);
    uStack_10c0._0_1_ = -((char)uStack_4b0 < (char)uStack_bb0);
    uStack_10c0._1_1_ = -(uStack_4b0._1_1_ < uStack_bb0._1_1_);
    uStack_10c0._2_1_ = -(uStack_4b0._2_1_ < uStack_bb0._2_1_);
    uStack_10c0._3_1_ = -(uStack_4b0._3_1_ < uStack_bb0._3_1_);
    uStack_10c0._4_1_ = -(uStack_4b0._4_1_ < uStack_bb0._4_1_);
    uStack_10c0._5_1_ = -(uStack_4b0._5_1_ < uStack_bb0._5_1_);
    uStack_10c0._6_1_ = -(uStack_4b0._6_1_ < uStack_bb0._6_1_);
    uStack_10c0._7_1_ = -(uStack_4b0._7_1_ < uStack_bb0._7_1_);
    local_9c8 = local_10d8;
    uStack_9c0 = uStack_10d0;
    local_9cc = 3;
    local_9c8._0_2_ = auVar94._0_2_;
    local_9c8._2_2_ = auVar94._2_2_;
    local_9c8._4_2_ = auVar94._4_2_;
    local_9c8._6_2_ = auVar94._6_2_;
    uStack_9c0._0_2_ = auVar94._8_2_;
    uStack_9c0._2_2_ = auVar94._10_2_;
    uStack_9c0._4_2_ = auVar94._12_2_;
    uStack_9c0._6_2_ = auVar94._14_2_;
    local_10d8._0_4_ = CONCAT22(local_9c8._2_2_ >> 3,(ushort)local_9c8 >> 3);
    local_10d8._0_6_ = CONCAT24(local_9c8._4_2_ >> 3,(undefined4)local_10d8);
    local_10d8 = CONCAT26(local_9c8._6_2_ >> 3,(undefined6)local_10d8);
    uStack_10d0._0_2_ = (ushort)uStack_9c0 >> 3;
    uStack_10d0._2_2_ = uStack_9c0._2_2_ >> 3;
    uStack_10d0._4_2_ = uStack_9c0._4_2_ >> 3;
    uStack_10d0._6_2_ = uStack_9c0._6_2_ >> 3;
    local_8e8 = local_10c8;
    uStack_8e0 = uStack_10c0;
    local_458 = local_10c8 & 0xe0e0e0e0e0e0e0e0;
    uStack_450 = uStack_10c0 & 0xe0e0e0e0e0e0e0e0;
    local_908 = local_10d8;
    uStack_900 = uStack_10d0;
    local_448 = local_10d8 & 0x1f1f1f1f1f1f1f1f;
    uStack_440 = uStack_10d0 & 0x1f1f1f1f1f1f1f1f;
    local_658 = local_448 | local_458;
    uStack_650 = uStack_440 | uStack_450;
    uStack_10d0 = uStack_650;
    local_10d8 = local_658;
    auVar55._8_8_ = uStack_640;
    auVar55._0_8_ = local_648;
    auVar54._8_8_ = uStack_650;
    auVar54._0_8_ = local_658;
    local_768 = psubsb(auVar55,auVar54);
    local_f88 = local_768._0_8_ ^ 0x8080808080808080;
    uStack_f80 = local_768._8_8_ ^ 0x8080808080808080;
    local_10e8 = auVar95._0_8_;
    uStack_10e0 = auVar95._8_8_;
    local_4c8 = local_e88;
    uStack_4c0 = uStack_e80;
    local_4d8 = local_10e8;
    uVar81 = local_4d8;
    uStack_4d0 = uStack_10e0;
    uVar82 = uStack_4d0;
    local_4d8._0_1_ = auVar95[0];
    local_4d8._1_1_ = auVar95[1];
    local_4d8._2_1_ = auVar95[2];
    local_4d8._3_1_ = auVar95[3];
    local_4d8._4_1_ = auVar95[4];
    local_4d8._5_1_ = auVar95[5];
    local_4d8._6_1_ = auVar95[6];
    local_4d8._7_1_ = auVar95[7];
    uStack_4d0._0_1_ = auVar95[8];
    uStack_4d0._1_1_ = auVar95[9];
    uStack_4d0._2_1_ = auVar95[10];
    uStack_4d0._3_1_ = auVar95[0xb];
    uStack_4d0._4_1_ = auVar95[0xc];
    uStack_4d0._5_1_ = auVar95[0xd];
    uStack_4d0._6_1_ = auVar95[0xe];
    uStack_4d0._7_1_ = auVar95[0xf];
    local_10c8._0_2_ =
         CONCAT11(-(local_4d8._1_1_ < local_bb8._1_1_),-((char)local_4d8 < (char)local_bb8));
    local_10c8._0_3_ = CONCAT12(-(local_4d8._2_1_ < local_bb8._2_1_),(undefined2)local_10c8);
    local_10c8._0_4_ = CONCAT13(-(local_4d8._3_1_ < local_bb8._3_1_),(undefined3)local_10c8);
    local_10c8._0_5_ = CONCAT14(-(local_4d8._4_1_ < local_bb8._4_1_),(undefined4)local_10c8);
    local_10c8._0_6_ = CONCAT15(-(local_4d8._5_1_ < local_bb8._5_1_),(undefined5)local_10c8);
    local_10c8._0_7_ = CONCAT16(-(local_4d8._6_1_ < local_bb8._6_1_),(undefined6)local_10c8);
    local_10c8 = CONCAT17(-(local_4d8._7_1_ < local_bb8._7_1_),(undefined7)local_10c8);
    uStack_10c0._0_1_ = -((char)uStack_4d0 < (char)uStack_bb0);
    uStack_10c0._1_1_ = -(uStack_4d0._1_1_ < uStack_bb0._1_1_);
    uStack_10c0._2_1_ = -(uStack_4d0._2_1_ < uStack_bb0._2_1_);
    uStack_10c0._3_1_ = -(uStack_4d0._3_1_ < uStack_bb0._3_1_);
    uStack_10c0._4_1_ = -(uStack_4d0._4_1_ < uStack_bb0._4_1_);
    uStack_10c0._5_1_ = -(uStack_4d0._5_1_ < uStack_bb0._5_1_);
    uStack_10c0._6_1_ = -(uStack_4d0._6_1_ < uStack_bb0._6_1_);
    uStack_10c0._7_1_ = -(uStack_4d0._7_1_ < uStack_bb0._7_1_);
    local_9e8 = local_10e8;
    uStack_9e0 = uStack_10e0;
    local_9ec = 3;
    local_9e8._0_2_ = auVar95._0_2_;
    local_9e8._2_2_ = auVar95._2_2_;
    local_9e8._4_2_ = auVar95._4_2_;
    local_9e8._6_2_ = auVar95._6_2_;
    uStack_9e0._0_2_ = auVar95._8_2_;
    uStack_9e0._2_2_ = auVar95._10_2_;
    uStack_9e0._4_2_ = auVar95._12_2_;
    uStack_9e0._6_2_ = auVar95._14_2_;
    local_10e8._0_4_ = CONCAT22(local_9e8._2_2_ >> 3,(ushort)local_9e8 >> 3);
    local_10e8._0_6_ = CONCAT24(local_9e8._4_2_ >> 3,(undefined4)local_10e8);
    local_10e8 = CONCAT26(local_9e8._6_2_ >> 3,(undefined6)local_10e8);
    uStack_10e0._0_2_ = (ushort)uStack_9e0 >> 3;
    uStack_10e0._2_2_ = uStack_9e0._2_2_ >> 3;
    uStack_10e0._4_2_ = uStack_9e0._4_2_ >> 3;
    uStack_10e0._6_2_ = uStack_9e0._6_2_ >> 3;
    local_928 = local_10c8;
    uStack_920 = uStack_10c0;
    local_478 = local_10c8 & 0xe0e0e0e0e0e0e0e0;
    uStack_470 = uStack_10c0 & 0xe0e0e0e0e0e0e0e0;
    local_948 = local_10e8;
    uStack_940 = uStack_10e0;
    local_468 = local_10e8 & 0x1f1f1f1f1f1f1f1f;
    uStack_460 = uStack_10e0 & 0x1f1f1f1f1f1f1f1f;
    local_5b8 = local_468 | local_478;
    uStack_5b0 = uStack_460 | uStack_470;
    uStack_10e0 = uStack_5b0;
    local_10e8 = local_5b8;
    auVar65._8_8_ = uStack_630;
    auVar65._0_8_ = local_638;
    auVar64._8_8_ = uStack_5b0;
    auVar64._0_8_ = local_5b8;
    local_788 = paddsb(auVar65,auVar64);
    local_f78 = local_788._0_8_ ^ 0x8080808080808080;
    uStack_f70 = local_788._8_8_ ^ 0x8080808080808080;
    auVar63._8_8_ = uStack_650;
    auVar63._0_8_ = local_658;
    auVar62._8_8_ = 0x101010101010101;
    auVar62._0_8_ = 0x101010101010101;
    auVar94 = paddsb(auVar63,auVar62);
    local_10b8 = auVar94._0_8_;
    uStack_10b0 = auVar94._8_8_;
    local_4e8 = local_e88;
    uStack_4e0 = uStack_e80;
    local_4f8 = local_10b8;
    uVar79 = local_4f8;
    uStack_4f0 = uStack_10b0;
    uVar80 = uStack_4f0;
    local_4f8._0_1_ = auVar94[0];
    local_4f8._1_1_ = auVar94[1];
    local_4f8._2_1_ = auVar94[2];
    local_4f8._3_1_ = auVar94[3];
    local_4f8._4_1_ = auVar94[4];
    local_4f8._5_1_ = auVar94[5];
    local_4f8._6_1_ = auVar94[6];
    local_4f8._7_1_ = auVar94[7];
    uStack_4f0._0_1_ = auVar94[8];
    uStack_4f0._1_1_ = auVar94[9];
    uStack_4f0._2_1_ = auVar94[10];
    uStack_4f0._3_1_ = auVar94[0xb];
    uStack_4f0._4_1_ = auVar94[0xc];
    uStack_4f0._5_1_ = auVar94[0xd];
    uStack_4f0._6_1_ = auVar94[0xe];
    uStack_4f0._7_1_ = auVar94[0xf];
    local_10c8._0_2_ =
         CONCAT11(-(local_4f8._1_1_ < local_bb8._1_1_),-((char)local_4f8 < (char)local_bb8));
    local_10c8._0_3_ = CONCAT12(-(local_4f8._2_1_ < local_bb8._2_1_),(undefined2)local_10c8);
    local_10c8._0_4_ = CONCAT13(-(local_4f8._3_1_ < local_bb8._3_1_),(undefined3)local_10c8);
    local_10c8._0_5_ = CONCAT14(-(local_4f8._4_1_ < local_bb8._4_1_),(undefined4)local_10c8);
    local_10c8._0_6_ = CONCAT15(-(local_4f8._5_1_ < local_bb8._5_1_),(undefined5)local_10c8);
    local_10c8._0_7_ = CONCAT16(-(local_4f8._6_1_ < local_bb8._6_1_),(undefined6)local_10c8);
    local_10c8 = CONCAT17(-(local_4f8._7_1_ < local_bb8._7_1_),(undefined7)local_10c8);
    uStack_10c0._0_1_ = -((char)uStack_4f0 < (char)uStack_bb0);
    uStack_10c0._1_1_ = -(uStack_4f0._1_1_ < uStack_bb0._1_1_);
    uStack_10c0._2_1_ = -(uStack_4f0._2_1_ < uStack_bb0._2_1_);
    uStack_10c0._3_1_ = -(uStack_4f0._3_1_ < uStack_bb0._3_1_);
    uStack_10c0._4_1_ = -(uStack_4f0._4_1_ < uStack_bb0._4_1_);
    uStack_10c0._5_1_ = -(uStack_4f0._5_1_ < uStack_bb0._5_1_);
    uStack_10c0._6_1_ = -(uStack_4f0._6_1_ < uStack_bb0._6_1_);
    uStack_10c0._7_1_ = -(uStack_4f0._7_1_ < uStack_bb0._7_1_);
    local_a08 = local_10b8;
    uStack_a00 = uStack_10b0;
    local_a0c = 1;
    local_a08._0_2_ = auVar94._0_2_;
    local_a08._2_2_ = auVar94._2_2_;
    local_a08._4_2_ = auVar94._4_2_;
    local_a08._6_2_ = auVar94._6_2_;
    uStack_a00._0_2_ = auVar94._8_2_;
    uStack_a00._2_2_ = auVar94._10_2_;
    uStack_a00._4_2_ = auVar94._12_2_;
    uStack_a00._6_2_ = auVar94._14_2_;
    local_10b8._0_4_ = CONCAT22(local_a08._2_2_ >> 1,(ushort)local_a08 >> 1);
    local_10b8._0_6_ = CONCAT24(local_a08._4_2_ >> 1,(undefined4)local_10b8);
    local_10b8 = CONCAT26(local_a08._6_2_ >> 1,(undefined6)local_10b8);
    uStack_10b0._0_2_ = (ushort)uStack_a00 >> 1;
    uStack_10b0._2_2_ = uStack_a00._2_2_ >> 1;
    uStack_10b0._4_2_ = uStack_a00._4_2_ >> 1;
    uStack_10b0._6_2_ = uStack_a00._6_2_ >> 1;
    local_968 = local_10c8;
    uStack_960 = uStack_10c0;
    local_498 = local_10c8 & 0x8080808080808080;
    uStack_490 = uStack_10c0 & 0x8080808080808080;
    uStack_10c0 = uStack_490;
    local_10c8 = local_498;
    local_988 = local_10b8;
    uStack_980 = uStack_10b0;
    local_488 = local_10b8 & 0x7f7f7f7f7f7f7f7f;
    uStack_480 = uStack_10b0 & 0x7f7f7f7f7f7f7f7f;
    local_438 = local_488 | local_498;
    uStack_430 = uStack_480 | uStack_490;
    local_678 = ~local_8b8 & local_438;
    uStack_670 = ~uStack_8b0 & uStack_430;
    uStack_10b0 = uStack_670;
    local_10b8 = local_678;
    auVar61._8_8_ = uStack_600;
    auVar61._0_8_ = local_608;
    auVar60._8_8_ = uStack_670;
    auVar60._0_8_ = local_678;
    local_7a8 = paddsb(auVar61,auVar60);
    local_f68 = local_7a8._0_8_ ^ 0x8080808080808080;
    uStack_f60 = local_7a8._8_8_ ^ 0x8080808080808080;
    auVar53._8_8_ = uStack_660;
    auVar53._0_8_ = local_668;
    auVar52._8_8_ = uStack_670;
    auVar52._0_8_ = local_678;
    local_7c8 = psubsb(auVar53,auVar52);
    local_f98 = local_7c8._0_8_ ^ 0x8080808080808080;
    uStack_f90 = local_7c8._8_8_ ^ 0x8080808080808080;
    local_c18 = local_e88;
    uStack_c10 = uStack_e80;
    local_c08._0_1_ = (char)local_ef8;
    local_c08._1_1_ = (char)(local_ef8 >> 8);
    local_c08._2_1_ = (char)(local_ef8 >> 0x10);
    local_c08._3_1_ = (char)(local_ef8 >> 0x18);
    local_c08._4_1_ = (char)(local_ef8 >> 0x20);
    local_c08._5_1_ = (char)(local_ef8 >> 0x28);
    local_c08._6_1_ = (char)(local_ef8 >> 0x30);
    local_c08._7_1_ = (char)(local_ef8 >> 0x38);
    uStack_c00._0_1_ = (char)uStack_ef0;
    uStack_c00._1_1_ = (char)(uStack_ef0 >> 8);
    uStack_c00._2_1_ = (char)(uStack_ef0 >> 0x10);
    uStack_c00._3_1_ = (char)(uStack_ef0 >> 0x18);
    uStack_c00._4_1_ = (char)(uStack_ef0 >> 0x20);
    uStack_c00._5_1_ = (char)(uStack_ef0 >> 0x28);
    uStack_c00._6_1_ = (char)(uStack_ef0 >> 0x30);
    uStack_c00._7_1_ = (char)(uStack_ef0 >> 0x38);
    local_698 = -((char)local_c08 == (char)local_bb8);
    cStack_697 = -(local_c08._1_1_ == local_bb8._1_1_);
    cStack_696 = -(local_c08._2_1_ == local_bb8._2_1_);
    cStack_695 = -(local_c08._3_1_ == local_bb8._3_1_);
    cStack_694 = -(local_c08._4_1_ == local_bb8._4_1_);
    cStack_693 = -(local_c08._5_1_ == local_bb8._5_1_);
    cStack_692 = -(local_c08._6_1_ == local_bb8._6_1_);
    cStack_691 = -(local_c08._7_1_ == local_bb8._7_1_);
    cStack_690 = -((char)uStack_c00 == (char)uStack_bb0);
    cStack_68f = -(uStack_c00._1_1_ == uStack_bb0._1_1_);
    cStack_68e = -(uStack_c00._2_1_ == uStack_bb0._2_1_);
    cStack_68d = -(uStack_c00._3_1_ == uStack_bb0._3_1_);
    cStack_68c = -(uStack_c00._4_1_ == uStack_bb0._4_1_);
    cStack_68b = -(uStack_c00._5_1_ == uStack_bb0._5_1_);
    cStack_68a = -(uStack_c00._6_1_ == uStack_bb0._6_1_);
    bStack_689 = -(uStack_c00._7_1_ == uStack_bb0._7_1_);
    auVar50[1] = cStack_697;
    auVar50[0] = local_698;
    auVar50[2] = cStack_696;
    auVar50[3] = cStack_695;
    auVar50[4] = cStack_694;
    auVar50[5] = cStack_693;
    auVar50[6] = cStack_692;
    auVar50[7] = cStack_691;
    auVar50[8] = cStack_690;
    auVar50[9] = cStack_68f;
    auVar50[10] = cStack_68e;
    auVar50[0xb] = cStack_68d;
    auVar50[0xc] = cStack_68c;
    auVar50[0xd] = cStack_68b;
    auVar50[0xe] = cStack_68a;
    auVar50[0xf] = bStack_689;
    if ((ushort)((ushort)(SUB161(auVar50 >> 7,0) & 1) | (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe | (ushort)(bStack_689 >> 7) << 0xf)
        == 0xffff) {
      puVar91 = (ulong *)((long)local_e50 - (long)(local_e54 << 1));
      *puVar91 = local_f68;
      puVar91[1] = uStack_f60;
      *(ulong *)((long)local_e50 - (long)local_e54) = local_f78;
      ((ulong *)((long)local_e50 - (long)local_e54))[1] = uStack_f70;
      *local_e50 = local_f88;
      local_e50[1] = uStack_f80;
      *(ulong *)((long)local_e50 + (long)local_e54) = local_f98;
      ((ulong *)((long)local_e50 + (long)local_e54))[1] = uStack_f90;
    }
    else {
      local_40a = 4;
      local_2 = 4;
      local_4 = 4;
      local_6 = 4;
      local_8 = 4;
      local_a = 4;
      local_c = 4;
      local_e = 4;
      local_10 = 4;
      local_10f8 = 0x4000400040004;
      uStack_10f0 = 0x4000400040004;
      local_d88 = local_f08;
      uVar72 = local_d88;
      uStack_d80 = uStack_f00;
      local_d98 = local_e88;
      uStack_d90 = uStack_e80;
      local_d88._0_1_ = (undefined1)local_f08;
      local_d88._1_1_ = (undefined1)((ulong)local_f08 >> 8);
      local_d88._2_1_ = (undefined1)((ulong)local_f08 >> 0x10);
      local_d88._3_1_ = (undefined1)((ulong)local_f08 >> 0x18);
      local_d88._4_1_ = (undefined1)((ulong)local_f08 >> 0x20);
      local_d88._5_1_ = (undefined1)((ulong)local_f08 >> 0x28);
      local_d88._6_1_ = (undefined1)((ulong)local_f08 >> 0x30);
      local_d88._7_1_ = (undefined1)((ulong)local_f08 >> 0x38);
      local_1108 = (undefined1)local_d88;
      cStack_1107 = (char)local_bb8;
      uStack_1106 = local_d88._1_1_;
      cStack_1105 = local_bb8._1_1_;
      uStack_1104 = local_d88._2_1_;
      cStack_1103 = local_bb8._2_1_;
      uStack_1102 = local_d88._3_1_;
      cStack_1101 = local_bb8._3_1_;
      uStack_1100 = local_d88._4_1_;
      cStack_10ff = local_bb8._4_1_;
      uStack_10fe = local_d88._5_1_;
      cStack_10fd = local_bb8._5_1_;
      uStack_10fc = local_d88._6_1_;
      cStack_10fb = local_bb8._6_1_;
      uStack_10fa = local_d88._7_1_;
      cStack_10f9 = local_bb8._7_1_;
      local_da8 = local_f18;
      uVar97 = local_da8;
      uStack_da0 = uStack_f10;
      local_db8 = local_e88;
      uStack_db0 = uStack_e80;
      local_da8._0_1_ = (undefined1)local_f18;
      local_da8._1_1_ = (undefined1)(local_f18 >> 8);
      local_da8._2_1_ = (undefined1)(local_f18 >> 0x10);
      local_da8._3_1_ = (undefined1)(local_f18 >> 0x18);
      local_da8._4_1_ = (undefined1)(local_f18 >> 0x20);
      local_da8._5_1_ = (undefined1)(local_f18 >> 0x28);
      local_da8._6_1_ = (undefined1)(local_f18 >> 0x30);
      local_da8._7_1_ = (undefined1)(local_f18 >> 0x38);
      local_1118 = (undefined1)local_da8;
      cStack_1117 = (char)local_bb8;
      uStack_1116 = local_da8._1_1_;
      cStack_1115 = local_bb8._1_1_;
      uStack_1114 = local_da8._2_1_;
      cStack_1113 = local_bb8._2_1_;
      uStack_1112 = local_da8._3_1_;
      cStack_1111 = local_bb8._3_1_;
      uStack_1110 = local_da8._4_1_;
      cStack_110f = local_bb8._4_1_;
      uStack_110e = local_da8._5_1_;
      cStack_110d = local_bb8._5_1_;
      uStack_110c = local_da8._6_1_;
      cStack_110b = local_bb8._6_1_;
      uStack_110a = local_da8._7_1_;
      cStack_1109 = local_bb8._7_1_;
      local_dc8 = local_f28;
      uVar96 = local_dc8;
      uStack_dc0 = uStack_f20;
      local_dd8 = local_e88;
      uStack_dd0 = uStack_e80;
      local_dc8._0_1_ = (undefined1)local_f28;
      local_dc8._1_1_ = (undefined1)(local_f28 >> 8);
      local_dc8._2_1_ = (undefined1)(local_f28 >> 0x10);
      local_dc8._3_1_ = (undefined1)(local_f28 >> 0x18);
      local_dc8._4_1_ = (undefined1)(local_f28 >> 0x20);
      local_dc8._5_1_ = (undefined1)(local_f28 >> 0x28);
      local_dc8._6_1_ = (undefined1)(local_f28 >> 0x30);
      local_dc8._7_1_ = (undefined1)(local_f28 >> 0x38);
      local_1128 = (undefined1)local_dc8;
      cStack_1127 = (char)local_bb8;
      uStack_1126 = local_dc8._1_1_;
      cStack_1125 = local_bb8._1_1_;
      uStack_1124 = local_dc8._2_1_;
      cStack_1123 = local_bb8._2_1_;
      uStack_1122 = local_dc8._3_1_;
      cStack_1121 = local_bb8._3_1_;
      uStack_1120 = local_dc8._4_1_;
      cStack_111f = local_bb8._4_1_;
      uStack_111e = local_dc8._5_1_;
      cStack_111d = local_bb8._5_1_;
      uStack_111c = local_dc8._6_1_;
      cStack_111b = local_bb8._6_1_;
      uStack_111a = local_dc8._7_1_;
      cStack_1119 = local_bb8._7_1_;
      local_de8 = local_f38;
      uVar93 = local_de8;
      uStack_de0 = uStack_f30;
      local_df8 = local_e88;
      uStack_df0 = uStack_e80;
      local_de8._0_1_ = (undefined1)local_f38;
      local_de8._1_1_ = (undefined1)(local_f38 >> 8);
      local_de8._2_1_ = (undefined1)(local_f38 >> 0x10);
      local_de8._3_1_ = (undefined1)(local_f38 >> 0x18);
      local_de8._4_1_ = (undefined1)(local_f38 >> 0x20);
      local_de8._5_1_ = (undefined1)(local_f38 >> 0x28);
      local_de8._6_1_ = (undefined1)(local_f38 >> 0x30);
      local_de8._7_1_ = (undefined1)(local_f38 >> 0x38);
      local_1138 = (undefined1)local_de8;
      cStack_1137 = (char)local_bb8;
      uStack_1136 = local_de8._1_1_;
      cStack_1135 = local_bb8._1_1_;
      uStack_1134 = local_de8._2_1_;
      cStack_1133 = local_bb8._2_1_;
      uStack_1132 = local_de8._3_1_;
      cStack_1131 = local_bb8._3_1_;
      uStack_1130 = local_de8._4_1_;
      cStack_112f = local_bb8._4_1_;
      uStack_112e = local_de8._5_1_;
      cStack_112d = local_bb8._5_1_;
      uStack_112c = local_de8._6_1_;
      cStack_112b = local_bb8._6_1_;
      uStack_112a = local_de8._7_1_;
      cStack_1129 = local_bb8._7_1_;
      local_e08 = local_f48;
      uVar92 = local_e08;
      uStack_e00 = uStack_f40;
      local_e18 = local_e88;
      uStack_e10 = uStack_e80;
      local_e08._0_1_ = (undefined1)local_f48;
      local_e08._1_1_ = (undefined1)(local_f48 >> 8);
      local_e08._2_1_ = (undefined1)(local_f48 >> 0x10);
      local_e08._3_1_ = (undefined1)(local_f48 >> 0x18);
      local_e08._4_1_ = (undefined1)(local_f48 >> 0x20);
      local_e08._5_1_ = (undefined1)(local_f48 >> 0x28);
      local_e08._6_1_ = (undefined1)(local_f48 >> 0x30);
      local_e08._7_1_ = (undefined1)(local_f48 >> 0x38);
      local_1148 = (undefined1)local_e08;
      cStack_1147 = (char)local_bb8;
      uStack_1146 = local_e08._1_1_;
      cStack_1145 = local_bb8._1_1_;
      uStack_1144 = local_e08._2_1_;
      cStack_1143 = local_bb8._2_1_;
      uStack_1142 = local_e08._3_1_;
      cStack_1141 = local_bb8._3_1_;
      uStack_1140 = local_e08._4_1_;
      cStack_113f = local_bb8._4_1_;
      uStack_113e = local_e08._5_1_;
      cStack_113d = local_bb8._5_1_;
      uStack_113c = local_e08._6_1_;
      cStack_113b = local_bb8._6_1_;
      uStack_113a = local_e08._7_1_;
      cStack_1139 = local_bb8._7_1_;
      local_e28 = local_f58;
      uVar71 = local_e28;
      uStack_e20 = uStack_f50;
      local_e38 = local_e88;
      uStack_e30 = uStack_e80;
      local_e28._0_1_ = (undefined1)local_f58;
      local_e28._1_1_ = (undefined1)((ulong)local_f58 >> 8);
      local_e28._2_1_ = (undefined1)((ulong)local_f58 >> 0x10);
      local_e28._3_1_ = (undefined1)((ulong)local_f58 >> 0x18);
      local_e28._4_1_ = (undefined1)((ulong)local_f58 >> 0x20);
      local_e28._5_1_ = (undefined1)((ulong)local_f58 >> 0x28);
      local_e28._6_1_ = (undefined1)((ulong)local_f58 >> 0x30);
      local_e28._7_1_ = (undefined1)((ulong)local_f58 >> 0x38);
      local_1158 = (undefined1)local_e28;
      cStack_1157 = (char)local_bb8;
      uStack_1156 = local_e28._1_1_;
      cStack_1155 = local_bb8._1_1_;
      uStack_1154 = local_e28._2_1_;
      cStack_1153 = local_bb8._2_1_;
      uStack_1152 = local_e28._3_1_;
      cStack_1151 = local_bb8._3_1_;
      uStack_1150 = local_e28._4_1_;
      cStack_114f = local_bb8._4_1_;
      uStack_114e = local_e28._5_1_;
      cStack_114d = local_bb8._5_1_;
      uStack_114c = local_e28._6_1_;
      cStack_114b = local_bb8._6_1_;
      uStack_114a = local_e28._7_1_;
      cStack_1149 = local_bb8._7_1_;
      local_358 = local_f08;
      uStack_350 = uStack_f00;
      uVar90 = uStack_350;
      local_368 = local_e88;
      uStack_360 = uStack_e80;
      uStack_350._0_1_ = (undefined1)uStack_f00;
      uStack_350._1_1_ = (undefined1)((ulong)uStack_f00 >> 8);
      uStack_350._2_1_ = (undefined1)((ulong)uStack_f00 >> 0x10);
      uStack_350._3_1_ = (undefined1)((ulong)uStack_f00 >> 0x18);
      uStack_350._4_1_ = (undefined1)((ulong)uStack_f00 >> 0x20);
      uStack_350._5_1_ = (undefined1)((ulong)uStack_f00 >> 0x28);
      uStack_350._6_1_ = (undefined1)((ulong)uStack_f00 >> 0x30);
      uStack_350._7_1_ = (undefined1)((ulong)uStack_f00 >> 0x38);
      local_1168 = (undefined1)uStack_350;
      cStack_1167 = (char)uStack_bb0;
      uStack_1166 = uStack_350._1_1_;
      cStack_1165 = uStack_bb0._1_1_;
      uStack_1164 = uStack_350._2_1_;
      cStack_1163 = uStack_bb0._2_1_;
      uStack_1162 = uStack_350._3_1_;
      cStack_1161 = uStack_bb0._3_1_;
      uStack_1160 = uStack_350._4_1_;
      cStack_115f = uStack_bb0._4_1_;
      uStack_115e = uStack_350._5_1_;
      cStack_115d = uStack_bb0._5_1_;
      uStack_115c = uStack_350._6_1_;
      cStack_115b = uStack_bb0._6_1_;
      uStack_115a = uStack_350._7_1_;
      cStack_1159 = uStack_bb0._7_1_;
      local_378 = local_f18;
      uStack_370 = uStack_f10;
      uVar89 = uStack_370;
      local_388 = local_e88;
      uStack_380 = uStack_e80;
      uStack_370._0_1_ = (undefined1)uStack_f10;
      uStack_370._1_1_ = (undefined1)(uStack_f10 >> 8);
      uStack_370._2_1_ = (undefined1)(uStack_f10 >> 0x10);
      uStack_370._3_1_ = (undefined1)(uStack_f10 >> 0x18);
      uStack_370._4_1_ = (undefined1)(uStack_f10 >> 0x20);
      uStack_370._5_1_ = (undefined1)(uStack_f10 >> 0x28);
      uStack_370._6_1_ = (undefined1)(uStack_f10 >> 0x30);
      uStack_370._7_1_ = (undefined1)(uStack_f10 >> 0x38);
      local_1178 = (undefined1)uStack_370;
      cStack_1177 = (char)uStack_bb0;
      uStack_1176 = uStack_370._1_1_;
      cStack_1175 = uStack_bb0._1_1_;
      uStack_1174 = uStack_370._2_1_;
      cStack_1173 = uStack_bb0._2_1_;
      uStack_1172 = uStack_370._3_1_;
      cStack_1171 = uStack_bb0._3_1_;
      uStack_1170 = uStack_370._4_1_;
      cStack_116f = uStack_bb0._4_1_;
      uStack_116e = uStack_370._5_1_;
      cStack_116d = uStack_bb0._5_1_;
      uStack_116c = uStack_370._6_1_;
      cStack_116b = uStack_bb0._6_1_;
      uStack_116a = uStack_370._7_1_;
      cStack_1169 = uStack_bb0._7_1_;
      local_398 = local_f28;
      uStack_390 = uStack_f20;
      uVar88 = uStack_390;
      local_3a8 = local_e88;
      uStack_3a0 = uStack_e80;
      uStack_390._0_1_ = (undefined1)uStack_f20;
      uStack_390._1_1_ = (undefined1)(uStack_f20 >> 8);
      uStack_390._2_1_ = (undefined1)(uStack_f20 >> 0x10);
      uStack_390._3_1_ = (undefined1)(uStack_f20 >> 0x18);
      uStack_390._4_1_ = (undefined1)(uStack_f20 >> 0x20);
      uStack_390._5_1_ = (undefined1)(uStack_f20 >> 0x28);
      uStack_390._6_1_ = (undefined1)(uStack_f20 >> 0x30);
      uStack_390._7_1_ = (undefined1)(uStack_f20 >> 0x38);
      local_1188 = (undefined1)uStack_390;
      cStack_1187 = (char)uStack_bb0;
      uStack_1186 = uStack_390._1_1_;
      cStack_1185 = uStack_bb0._1_1_;
      uStack_1184 = uStack_390._2_1_;
      cStack_1183 = uStack_bb0._2_1_;
      uStack_1182 = uStack_390._3_1_;
      cStack_1181 = uStack_bb0._3_1_;
      uStack_1180 = uStack_390._4_1_;
      cStack_117f = uStack_bb0._4_1_;
      uStack_117e = uStack_390._5_1_;
      cStack_117d = uStack_bb0._5_1_;
      uStack_117c = uStack_390._6_1_;
      cStack_117b = uStack_bb0._6_1_;
      uStack_117a = uStack_390._7_1_;
      cStack_1179 = uStack_bb0._7_1_;
      local_3b8 = local_f38;
      uStack_3b0 = uStack_f30;
      uVar87 = uStack_3b0;
      local_3c8 = local_e88;
      uStack_3c0 = uStack_e80;
      uStack_3b0._0_1_ = (undefined1)uStack_f30;
      uStack_3b0._1_1_ = (undefined1)(uStack_f30 >> 8);
      uStack_3b0._2_1_ = (undefined1)(uStack_f30 >> 0x10);
      uStack_3b0._3_1_ = (undefined1)(uStack_f30 >> 0x18);
      uStack_3b0._4_1_ = (undefined1)(uStack_f30 >> 0x20);
      uStack_3b0._5_1_ = (undefined1)(uStack_f30 >> 0x28);
      uStack_3b0._6_1_ = (undefined1)(uStack_f30 >> 0x30);
      uStack_3b0._7_1_ = (undefined1)(uStack_f30 >> 0x38);
      local_1198 = (undefined1)uStack_3b0;
      cStack_1197 = (char)uStack_bb0;
      uStack_1196 = uStack_3b0._1_1_;
      cStack_1195 = uStack_bb0._1_1_;
      uStack_1194 = uStack_3b0._2_1_;
      cStack_1193 = uStack_bb0._2_1_;
      uStack_1192 = uStack_3b0._3_1_;
      cStack_1191 = uStack_bb0._3_1_;
      uStack_1190 = uStack_3b0._4_1_;
      cStack_118f = uStack_bb0._4_1_;
      uStack_118e = uStack_3b0._5_1_;
      cStack_118d = uStack_bb0._5_1_;
      uStack_118c = uStack_3b0._6_1_;
      cStack_118b = uStack_bb0._6_1_;
      uStack_118a = uStack_3b0._7_1_;
      cStack_1189 = uStack_bb0._7_1_;
      local_3d8 = local_f48;
      uStack_3d0 = uStack_f40;
      uVar86 = uStack_3d0;
      local_3e8 = local_e88;
      uStack_3e0 = uStack_e80;
      uStack_3d0._0_1_ = (undefined1)uStack_f40;
      uStack_3d0._1_1_ = (undefined1)(uStack_f40 >> 8);
      uStack_3d0._2_1_ = (undefined1)(uStack_f40 >> 0x10);
      uStack_3d0._3_1_ = (undefined1)(uStack_f40 >> 0x18);
      uStack_3d0._4_1_ = (undefined1)(uStack_f40 >> 0x20);
      uStack_3d0._5_1_ = (undefined1)(uStack_f40 >> 0x28);
      uStack_3d0._6_1_ = (undefined1)(uStack_f40 >> 0x30);
      uStack_3d0._7_1_ = (undefined1)(uStack_f40 >> 0x38);
      local_11a8 = (undefined1)uStack_3d0;
      cStack_11a7 = (char)uStack_bb0;
      uStack_11a6 = uStack_3d0._1_1_;
      cStack_11a5 = uStack_bb0._1_1_;
      uStack_11a4 = uStack_3d0._2_1_;
      cStack_11a3 = uStack_bb0._2_1_;
      uStack_11a2 = uStack_3d0._3_1_;
      cStack_11a1 = uStack_bb0._3_1_;
      uStack_11a0 = uStack_3d0._4_1_;
      cStack_119f = uStack_bb0._4_1_;
      uStack_119e = uStack_3d0._5_1_;
      cStack_119d = uStack_bb0._5_1_;
      uStack_119c = uStack_3d0._6_1_;
      cStack_119b = uStack_bb0._6_1_;
      uStack_119a = uStack_3d0._7_1_;
      cStack_1199 = uStack_bb0._7_1_;
      local_3f8 = local_f58;
      uStack_3f0 = uStack_f50;
      uVar85 = uStack_3f0;
      local_408 = local_e88;
      uStack_400 = uStack_e80;
      uStack_3f0._0_1_ = (undefined1)uStack_f50;
      uStack_3f0._1_1_ = (undefined1)((ulong)uStack_f50 >> 8);
      uStack_3f0._2_1_ = (undefined1)((ulong)uStack_f50 >> 0x10);
      uStack_3f0._3_1_ = (undefined1)((ulong)uStack_f50 >> 0x18);
      uStack_3f0._4_1_ = (undefined1)((ulong)uStack_f50 >> 0x20);
      uStack_3f0._5_1_ = (undefined1)((ulong)uStack_f50 >> 0x28);
      uStack_3f0._6_1_ = (undefined1)((ulong)uStack_f50 >> 0x30);
      uStack_3f0._7_1_ = (undefined1)((ulong)uStack_f50 >> 0x38);
      local_11b8 = (undefined1)uStack_3f0;
      cStack_11b7 = (char)uStack_bb0;
      uStack_11b6 = uStack_3f0._1_1_;
      cStack_11b5 = uStack_bb0._1_1_;
      uStack_11b4 = uStack_3f0._2_1_;
      cStack_11b3 = uStack_bb0._2_1_;
      uStack_11b2 = uStack_3f0._3_1_;
      cStack_11b1 = uStack_bb0._3_1_;
      uStack_11b0 = uStack_3f0._4_1_;
      cStack_11af = uStack_bb0._4_1_;
      uStack_11ae = uStack_3f0._5_1_;
      cStack_11ad = uStack_bb0._5_1_;
      uStack_11ac = uStack_3f0._6_1_;
      cStack_11ab = uStack_bb0._6_1_;
      uStack_11aa = uStack_3f0._7_1_;
      cStack_11a9 = uStack_bb0._7_1_;
      uVar3 = CONCAT13(local_bb8._1_1_,
                       CONCAT12(local_d88._1_1_,CONCAT11((char)local_bb8,(undefined1)local_d88)));
      uVar4 = CONCAT15(local_bb8._2_1_,CONCAT14(local_d88._2_1_,uVar3));
      uVar36 = CONCAT17(local_bb8._3_1_,CONCAT16(local_d88._3_1_,uVar4));
      uVar6 = CONCAT13(local_bb8._5_1_,
                       CONCAT12(local_d88._5_1_,CONCAT11(local_bb8._4_1_,local_d88._4_1_)));
      uVar7 = CONCAT15(local_bb8._6_1_,CONCAT14(local_d88._6_1_,uVar6));
      uVar39 = CONCAT17(local_bb8._7_1_,CONCAT16(local_d88._7_1_,uVar7));
      local_158._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_158._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_158._6_2_ = (short)((ulong)uVar36 >> 0x30);
      uStack_150._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_150._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_150._6_2_ = (short)((ulong)uVar39 >> 0x30);
      local_198 = CONCAT11((char)local_bb8,(undefined1)local_d88) + 4;
      sStack_196 = local_158._2_2_ + 4;
      sStack_194 = local_158._4_2_ + 4;
      sStack_192 = local_158._6_2_ + 4;
      sStack_190 = CONCAT11(local_bb8._4_1_,local_d88._4_1_) + 4;
      sStack_18e = uStack_150._2_2_ + 4;
      sStack_18c = uStack_150._4_2_ + 4;
      sStack_18a = uStack_150._6_2_ + 4;
      uVar3 = CONCAT13(local_bb8._1_1_,
                       CONCAT12(local_d88._1_1_,CONCAT11((char)local_bb8,(undefined1)local_d88)));
      uVar4 = CONCAT15(local_bb8._2_1_,CONCAT14(local_d88._2_1_,uVar3));
      uVar37 = CONCAT17(local_bb8._3_1_,CONCAT16(local_d88._3_1_,uVar4));
      uVar10 = CONCAT13(local_bb8._5_1_,
                        CONCAT12(local_d88._5_1_,CONCAT11(local_bb8._4_1_,local_d88._4_1_)));
      uVar11 = CONCAT15(local_bb8._6_1_,CONCAT14(local_d88._6_1_,uVar10));
      uVar40 = CONCAT17(local_bb8._7_1_,CONCAT16(local_d88._7_1_,uVar11));
      uVar6 = CONCAT13(local_bb8._1_1_,
                       CONCAT12(local_d88._1_1_,CONCAT11((char)local_bb8,(undefined1)local_d88)));
      uVar7 = CONCAT15(local_bb8._2_1_,CONCAT14(local_d88._2_1_,uVar6));
      uVar38 = CONCAT17(local_bb8._3_1_,CONCAT16(local_d88._3_1_,uVar7));
      uVar14 = CONCAT13(local_bb8._5_1_,
                        CONCAT12(local_d88._5_1_,CONCAT11(local_bb8._4_1_,local_d88._4_1_)));
      uVar15 = CONCAT15(local_bb8._6_1_,CONCAT14(local_d88._6_1_,uVar14));
      uVar41 = CONCAT17(local_bb8._7_1_,CONCAT16(local_d88._7_1_,uVar15));
      local_178._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_178._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_178._6_2_ = (short)((ulong)uVar37 >> 0x30);
      uStack_170._2_2_ = (short)((uint)uVar10 >> 0x10);
      uStack_170._4_2_ = (short)((uint6)uVar11 >> 0x20);
      uStack_170._6_2_ = (short)((ulong)uVar40 >> 0x30);
      local_188._2_2_ = (short)((uint)uVar6 >> 0x10);
      local_188._4_2_ = (short)((uint6)uVar7 >> 0x20);
      local_188._6_2_ = (short)((ulong)uVar38 >> 0x30);
      uStack_180._2_2_ = (short)((uint)uVar14 >> 0x10);
      uStack_180._4_2_ = (short)((uint6)uVar15 >> 0x20);
      uStack_180._6_2_ = (short)((ulong)uVar41 >> 0x30);
      local_1a8 = CONCAT11((char)local_bb8,(undefined1)local_d88) +
                  CONCAT11((char)local_bb8,(undefined1)local_d88);
      sStack_1a6 = local_178._2_2_ + local_188._2_2_;
      sStack_1a4 = local_178._4_2_ + local_188._4_2_;
      sStack_1a2 = local_178._6_2_ + local_188._6_2_;
      sStack_1a0 = CONCAT11(local_bb8._4_1_,local_d88._4_1_) +
                   CONCAT11(local_bb8._4_1_,local_d88._4_1_);
      sStack_19e = uStack_170._2_2_ + uStack_180._2_2_;
      sStack_19c = uStack_170._4_2_ + uStack_180._4_2_;
      sStack_19a = uStack_170._6_2_ + uStack_180._6_2_;
      local_11c8._0_4_ = CONCAT22(sStack_196 + sStack_1a6,local_198 + local_1a8);
      local_11c8._0_6_ = CONCAT24(sStack_194 + sStack_1a4,(undefined4)local_11c8);
      local_11c8 = CONCAT26(sStack_192 + sStack_1a2,(undefined6)local_11c8);
      uStack_11c0._0_4_ = CONCAT22(sStack_18e + sStack_19e,sStack_190 + sStack_1a0);
      uStack_11c0._0_6_ = CONCAT24(sStack_18c + sStack_19c,(undefined4)uStack_11c0);
      uStack_11c0 = CONCAT26(sStack_18a + sStack_19a,(undefined6)uStack_11c0);
      uVar3 = CONCAT13(local_bb8._1_1_,
                       CONCAT12(local_da8._1_1_,CONCAT11((char)local_bb8,(undefined1)local_da8)));
      uVar4 = CONCAT15(local_bb8._2_1_,CONCAT14(local_da8._2_1_,uVar3));
      uVar32 = CONCAT17(local_bb8._3_1_,CONCAT16(local_da8._3_1_,uVar4));
      uVar6 = CONCAT13(local_bb8._5_1_,
                       CONCAT12(local_da8._5_1_,CONCAT11(local_bb8._4_1_,local_da8._4_1_)));
      uVar7 = CONCAT15(local_bb8._6_1_,CONCAT14(local_da8._6_1_,uVar6));
      uVar34 = CONCAT17(local_bb8._7_1_,CONCAT16(local_da8._7_1_,uVar7));
      local_1c8 = local_11c8;
      lStack_1c0 = uStack_11c0;
      local_1b8._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_1b8._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_1b8._6_2_ = (short)((ulong)uVar32 >> 0x30);
      uStack_1b0._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_1b0._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_1b0._6_2_ = (short)((ulong)uVar34 >> 0x30);
      local_1f8 = CONCAT11((char)local_bb8,(undefined1)local_da8) + local_198 + local_1a8;
      sStack_1f6 = local_1b8._2_2_ + sStack_196 + sStack_1a6;
      sStack_1f4 = local_1b8._4_2_ + sStack_194 + sStack_1a4;
      sStack_1f2 = local_1b8._6_2_ + sStack_192 + sStack_1a2;
      sStack_1f0 = CONCAT11(local_bb8._4_1_,local_da8._4_1_) + sStack_190 + sStack_1a0;
      sStack_1ee = uStack_1b0._2_2_ + sStack_18e + sStack_19e;
      sStack_1ec = uStack_1b0._4_2_ + sStack_18c + sStack_19c;
      sStack_1ea = uStack_1b0._6_2_ + sStack_18a + sStack_19a;
      uVar10 = CONCAT13(local_bb8._1_1_,
                        CONCAT12(local_da8._1_1_,CONCAT11((char)local_bb8,(undefined1)local_da8)));
      uVar11 = CONCAT15(local_bb8._2_1_,CONCAT14(local_da8._2_1_,uVar10));
      uVar33 = CONCAT17(local_bb8._3_1_,CONCAT16(local_da8._3_1_,uVar11));
      uVar14 = CONCAT13(local_bb8._5_1_,
                        CONCAT12(local_da8._5_1_,CONCAT11(local_bb8._4_1_,local_da8._4_1_)));
      uVar15 = CONCAT15(local_bb8._6_1_,CONCAT14(local_da8._6_1_,uVar14));
      uVar35 = CONCAT17(local_bb8._7_1_,CONCAT16(local_da8._7_1_,uVar15));
      uVar3 = CONCAT13(local_bb8._1_1_,
                       CONCAT12(local_dc8._1_1_,CONCAT11((char)local_bb8,(undefined1)local_dc8)));
      uVar4 = CONCAT15(local_bb8._2_1_,CONCAT14(local_dc8._2_1_,uVar3));
      uVar28 = CONCAT17(local_bb8._3_1_,CONCAT16(local_dc8._3_1_,uVar4));
      uVar6 = CONCAT13(local_bb8._5_1_,
                       CONCAT12(local_dc8._5_1_,CONCAT11(local_bb8._4_1_,local_dc8._4_1_)));
      uVar7 = CONCAT15(local_bb8._6_1_,CONCAT14(local_dc8._6_1_,uVar6));
      uVar30 = CONCAT17(local_bb8._7_1_,CONCAT16(local_dc8._7_1_,uVar7));
      local_1d8._2_2_ = (short)((uint)uVar10 >> 0x10);
      local_1d8._4_2_ = (short)((uint6)uVar11 >> 0x20);
      local_1d8._6_2_ = (short)((ulong)uVar33 >> 0x30);
      uStack_1d0._2_2_ = (short)((uint)uVar14 >> 0x10);
      uStack_1d0._4_2_ = (short)((uint6)uVar15 >> 0x20);
      uStack_1d0._6_2_ = (short)((ulong)uVar35 >> 0x30);
      local_1e8._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_1e8._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_1e8._6_2_ = (short)((ulong)uVar28 >> 0x30);
      uStack_1e0._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_1e0._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_1e0._6_2_ = (short)((ulong)uVar30 >> 0x30);
      local_208 = CONCAT11((char)local_bb8,(undefined1)local_da8) +
                  CONCAT11((char)local_bb8,(undefined1)local_dc8);
      sStack_206 = local_1d8._2_2_ + local_1e8._2_2_;
      sStack_204 = local_1d8._4_2_ + local_1e8._4_2_;
      sStack_202 = local_1d8._6_2_ + local_1e8._6_2_;
      sStack_200 = CONCAT11(local_bb8._4_1_,local_da8._4_1_) +
                   CONCAT11(local_bb8._4_1_,local_dc8._4_1_);
      sStack_1fe = uStack_1d0._2_2_ + uStack_1e0._2_2_;
      sStack_1fc = uStack_1d0._4_2_ + uStack_1e0._4_2_;
      sStack_1fa = uStack_1d0._6_2_ + uStack_1e0._6_2_;
      local_11c8._0_4_ = CONCAT22(sStack_1f6 + sStack_206,local_1f8 + local_208);
      local_11c8._0_6_ = CONCAT24(sStack_1f4 + sStack_204,(undefined4)local_11c8);
      local_11c8 = CONCAT26(sStack_1f2 + sStack_202,(undefined6)local_11c8);
      uStack_11c0._0_4_ = CONCAT22(sStack_1ee + sStack_1fe,sStack_1f0 + sStack_200);
      uStack_11c0._0_6_ = CONCAT24(sStack_1ec + sStack_1fc,(undefined4)uStack_11c0);
      uStack_11c0 = CONCAT26(sStack_1ea + sStack_1fa,(undefined6)uStack_11c0);
      uVar10 = CONCAT13(local_bb8._1_1_,
                        CONCAT12(local_dc8._1_1_,CONCAT11((char)local_bb8,(undefined1)local_dc8)));
      uVar11 = CONCAT15(local_bb8._2_1_,CONCAT14(local_dc8._2_1_,uVar10));
      uVar29 = CONCAT17(local_bb8._3_1_,CONCAT16(local_dc8._3_1_,uVar11));
      uVar14 = CONCAT13(local_bb8._5_1_,
                        CONCAT12(local_dc8._5_1_,CONCAT11(local_bb8._4_1_,local_dc8._4_1_)));
      uVar15 = CONCAT15(local_bb8._6_1_,CONCAT14(local_dc8._6_1_,uVar14));
      uVar31 = CONCAT17(local_bb8._7_1_,CONCAT16(local_dc8._7_1_,uVar15));
      uVar3 = CONCAT13(local_bb8._1_1_,
                       CONCAT12(local_de8._1_1_,CONCAT11((char)local_bb8,(undefined1)local_de8)));
      uVar4 = CONCAT15(local_bb8._2_1_,CONCAT14(local_de8._2_1_,uVar3));
      uVar26 = CONCAT17(local_bb8._3_1_,CONCAT16(local_de8._3_1_,uVar4));
      uVar6 = CONCAT13(local_bb8._5_1_,
                       CONCAT12(local_de8._5_1_,CONCAT11(local_bb8._4_1_,local_de8._4_1_)));
      uVar7 = CONCAT15(local_bb8._6_1_,CONCAT14(local_de8._6_1_,uVar6));
      uVar27 = CONCAT17(local_bb8._7_1_,CONCAT16(local_de8._7_1_,uVar7));
      local_218._2_2_ = (short)((uint)uVar10 >> 0x10);
      local_218._4_2_ = (short)((uint6)uVar11 >> 0x20);
      local_218._6_2_ = (short)((ulong)uVar29 >> 0x30);
      uStack_210._2_2_ = (short)((uint)uVar14 >> 0x10);
      uStack_210._4_2_ = (short)((uint6)uVar15 >> 0x20);
      uStack_210._6_2_ = (short)((ulong)uVar31 >> 0x30);
      local_228._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_228._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_228._6_2_ = (short)((ulong)uVar26 >> 0x30);
      uStack_220._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_220._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_220._6_2_ = (short)((ulong)uVar27 >> 0x30);
      local_238 = CONCAT11((char)local_bb8,(undefined1)local_dc8) +
                  CONCAT11((char)local_bb8,(undefined1)local_de8);
      sStack_236 = local_218._2_2_ + local_228._2_2_;
      sStack_234 = local_218._4_2_ + local_228._4_2_;
      sStack_232 = local_218._6_2_ + local_228._6_2_;
      sStack_230 = CONCAT11(local_bb8._4_1_,local_dc8._4_1_) +
                   CONCAT11(local_bb8._4_1_,local_de8._4_1_);
      sStack_22e = uStack_210._2_2_ + uStack_220._2_2_;
      sStack_22c = uStack_210._4_2_ + uStack_220._4_2_;
      sStack_22a = uStack_210._6_2_ + uStack_220._6_2_;
      local_248 = local_11c8;
      lStack_240 = uStack_11c0;
      local_11c8._0_4_ =
           CONCAT22(sStack_236 + sStack_1f6 + sStack_206,local_238 + local_1f8 + local_208);
      local_11c8._0_6_ = CONCAT24(sStack_234 + sStack_1f4 + sStack_204,(undefined4)local_11c8);
      local_11c8 = CONCAT26(sStack_232 + sStack_1f2 + sStack_202,(undefined6)local_11c8);
      uStack_11c0._0_4_ =
           CONCAT22(sStack_22e + sStack_1ee + sStack_1fe,sStack_230 + sStack_1f0 + sStack_200);
      uStack_11c0._0_6_ = CONCAT24(sStack_22c + sStack_1ec + sStack_1fc,(undefined4)uStack_11c0);
      uStack_11c0 = CONCAT26(sStack_22a + sStack_1ea + sStack_1fa,(undefined6)uStack_11c0);
      uVar3 = CONCAT13(uStack_bb0._1_1_,
                       CONCAT12(uStack_350._1_1_,CONCAT11((char)uStack_bb0,(undefined1)uStack_350)))
      ;
      uVar4 = CONCAT15(uStack_bb0._2_1_,CONCAT14(uStack_350._2_1_,uVar3));
      uVar20 = CONCAT17(uStack_bb0._3_1_,CONCAT16(uStack_350._3_1_,uVar4));
      uVar6 = CONCAT13(uStack_bb0._5_1_,
                       CONCAT12(uStack_350._5_1_,CONCAT11(uStack_bb0._4_1_,uStack_350._4_1_)));
      uVar7 = CONCAT15(uStack_bb0._6_1_,CONCAT14(uStack_350._6_1_,uVar6));
      uVar23 = CONCAT17(uStack_bb0._7_1_,CONCAT16(uStack_350._7_1_,uVar7));
      local_258._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_258._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_258._6_2_ = (short)((ulong)uVar20 >> 0x30);
      uStack_250._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_250._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_250._6_2_ = (short)((ulong)uVar23 >> 0x30);
      local_298 = CONCAT11((char)uStack_bb0,(undefined1)uStack_350) + 4;
      sStack_296 = local_258._2_2_ + 4;
      sStack_294 = local_258._4_2_ + 4;
      sStack_292 = local_258._6_2_ + 4;
      sStack_290 = CONCAT11(uStack_bb0._4_1_,uStack_350._4_1_) + 4;
      sStack_28e = uStack_250._2_2_ + 4;
      sStack_28c = uStack_250._4_2_ + 4;
      sStack_28a = uStack_250._6_2_ + 4;
      uVar3 = CONCAT13(uStack_bb0._1_1_,
                       CONCAT12(uStack_350._1_1_,CONCAT11((char)uStack_bb0,(undefined1)uStack_350)))
      ;
      uVar4 = CONCAT15(uStack_bb0._2_1_,CONCAT14(uStack_350._2_1_,uVar3));
      uVar21 = CONCAT17(uStack_bb0._3_1_,CONCAT16(uStack_350._3_1_,uVar4));
      uVar10 = CONCAT13(uStack_bb0._5_1_,
                        CONCAT12(uStack_350._5_1_,CONCAT11(uStack_bb0._4_1_,uStack_350._4_1_)));
      uVar11 = CONCAT15(uStack_bb0._6_1_,CONCAT14(uStack_350._6_1_,uVar10));
      uVar24 = CONCAT17(uStack_bb0._7_1_,CONCAT16(uStack_350._7_1_,uVar11));
      uVar6 = CONCAT13(uStack_bb0._1_1_,
                       CONCAT12(uStack_350._1_1_,CONCAT11((char)uStack_bb0,(undefined1)uStack_350)))
      ;
      uVar7 = CONCAT15(uStack_bb0._2_1_,CONCAT14(uStack_350._2_1_,uVar6));
      uVar22 = CONCAT17(uStack_bb0._3_1_,CONCAT16(uStack_350._3_1_,uVar7));
      uVar14 = CONCAT13(uStack_bb0._5_1_,
                        CONCAT12(uStack_350._5_1_,CONCAT11(uStack_bb0._4_1_,uStack_350._4_1_)));
      uVar15 = CONCAT15(uStack_bb0._6_1_,CONCAT14(uStack_350._6_1_,uVar14));
      uVar25 = CONCAT17(uStack_bb0._7_1_,CONCAT16(uStack_350._7_1_,uVar15));
      local_278._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_278._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_278._6_2_ = (short)((ulong)uVar21 >> 0x30);
      uStack_270._2_2_ = (short)((uint)uVar10 >> 0x10);
      uStack_270._4_2_ = (short)((uint6)uVar11 >> 0x20);
      uStack_270._6_2_ = (short)((ulong)uVar24 >> 0x30);
      local_288._2_2_ = (short)((uint)uVar6 >> 0x10);
      local_288._4_2_ = (short)((uint6)uVar7 >> 0x20);
      local_288._6_2_ = (short)((ulong)uVar22 >> 0x30);
      uStack_280._2_2_ = (short)((uint)uVar14 >> 0x10);
      uStack_280._4_2_ = (short)((uint6)uVar15 >> 0x20);
      uStack_280._6_2_ = (short)((ulong)uVar25 >> 0x30);
      local_2a8 = CONCAT11((char)uStack_bb0,(undefined1)uStack_350) +
                  CONCAT11((char)uStack_bb0,(undefined1)uStack_350);
      sStack_2a6 = local_278._2_2_ + local_288._2_2_;
      sStack_2a4 = local_278._4_2_ + local_288._4_2_;
      sStack_2a2 = local_278._6_2_ + local_288._6_2_;
      sStack_2a0 = CONCAT11(uStack_bb0._4_1_,uStack_350._4_1_) +
                   CONCAT11(uStack_bb0._4_1_,uStack_350._4_1_);
      sStack_29e = uStack_270._2_2_ + uStack_280._2_2_;
      sStack_29c = uStack_270._4_2_ + uStack_280._4_2_;
      sStack_29a = uStack_270._6_2_ + uStack_280._6_2_;
      local_11d8._0_4_ = CONCAT22(sStack_296 + sStack_2a6,local_298 + local_2a8);
      local_11d8._0_6_ = CONCAT24(sStack_294 + sStack_2a4,(undefined4)local_11d8);
      local_11d8 = CONCAT26(sStack_292 + sStack_2a2,(undefined6)local_11d8);
      uStack_11d0._0_4_ = CONCAT22(sStack_28e + sStack_29e,sStack_290 + sStack_2a0);
      uStack_11d0._0_6_ = CONCAT24(sStack_28c + sStack_29c,(undefined4)uStack_11d0);
      uStack_11d0 = CONCAT26(sStack_28a + sStack_29a,(undefined6)uStack_11d0);
      uVar3 = CONCAT13(uStack_bb0._1_1_,
                       CONCAT12(uStack_370._1_1_,CONCAT11((char)uStack_bb0,(undefined1)uStack_370)))
      ;
      uVar4 = CONCAT15(uStack_bb0._2_1_,CONCAT14(uStack_370._2_1_,uVar3));
      uVar16 = CONCAT17(uStack_bb0._3_1_,CONCAT16(uStack_370._3_1_,uVar4));
      uVar6 = CONCAT13(uStack_bb0._5_1_,
                       CONCAT12(uStack_370._5_1_,CONCAT11(uStack_bb0._4_1_,uStack_370._4_1_)));
      uVar7 = CONCAT15(uStack_bb0._6_1_,CONCAT14(uStack_370._6_1_,uVar6));
      uVar18 = CONCAT17(uStack_bb0._7_1_,CONCAT16(uStack_370._7_1_,uVar7));
      local_2c8 = local_11d8;
      lStack_2c0 = uStack_11d0;
      local_2b8._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_2b8._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_2b8._6_2_ = (short)((ulong)uVar16 >> 0x30);
      uStack_2b0._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_2b0._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_2b0._6_2_ = (short)((ulong)uVar18 >> 0x30);
      local_2f8 = CONCAT11((char)uStack_bb0,(undefined1)uStack_370) + local_298 + local_2a8;
      sStack_2f6 = local_2b8._2_2_ + sStack_296 + sStack_2a6;
      sStack_2f4 = local_2b8._4_2_ + sStack_294 + sStack_2a4;
      sStack_2f2 = local_2b8._6_2_ + sStack_292 + sStack_2a2;
      sStack_2f0 = CONCAT11(uStack_bb0._4_1_,uStack_370._4_1_) + sStack_290 + sStack_2a0;
      sStack_2ee = uStack_2b0._2_2_ + sStack_28e + sStack_29e;
      sStack_2ec = uStack_2b0._4_2_ + sStack_28c + sStack_29c;
      sStack_2ea = uStack_2b0._6_2_ + sStack_28a + sStack_29a;
      uVar10 = CONCAT13(uStack_bb0._1_1_,
                        CONCAT12(uStack_370._1_1_,CONCAT11((char)uStack_bb0,(undefined1)uStack_370))
                       );
      uVar11 = CONCAT15(uStack_bb0._2_1_,CONCAT14(uStack_370._2_1_,uVar10));
      uVar17 = CONCAT17(uStack_bb0._3_1_,CONCAT16(uStack_370._3_1_,uVar11));
      uVar14 = CONCAT13(uStack_bb0._5_1_,
                        CONCAT12(uStack_370._5_1_,CONCAT11(uStack_bb0._4_1_,uStack_370._4_1_)));
      uVar15 = CONCAT15(uStack_bb0._6_1_,CONCAT14(uStack_370._6_1_,uVar14));
      uVar19 = CONCAT17(uStack_bb0._7_1_,CONCAT16(uStack_370._7_1_,uVar15));
      uVar3 = CONCAT13(uStack_bb0._1_1_,
                       CONCAT12(uStack_390._1_1_,CONCAT11((char)uStack_bb0,(undefined1)uStack_390)))
      ;
      uVar4 = CONCAT15(uStack_bb0._2_1_,CONCAT14(uStack_390._2_1_,uVar3));
      uVar8 = CONCAT17(uStack_bb0._3_1_,CONCAT16(uStack_390._3_1_,uVar4));
      uVar6 = CONCAT13(uStack_bb0._5_1_,
                       CONCAT12(uStack_390._5_1_,CONCAT11(uStack_bb0._4_1_,uStack_390._4_1_)));
      uVar7 = CONCAT15(uStack_bb0._6_1_,CONCAT14(uStack_390._6_1_,uVar6));
      uVar12 = CONCAT17(uStack_bb0._7_1_,CONCAT16(uStack_390._7_1_,uVar7));
      local_2d8._2_2_ = (short)((uint)uVar10 >> 0x10);
      local_2d8._4_2_ = (short)((uint6)uVar11 >> 0x20);
      local_2d8._6_2_ = (short)((ulong)uVar17 >> 0x30);
      uStack_2d0._2_2_ = (short)((uint)uVar14 >> 0x10);
      uStack_2d0._4_2_ = (short)((uint6)uVar15 >> 0x20);
      uStack_2d0._6_2_ = (short)((ulong)uVar19 >> 0x30);
      local_2e8._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_2e8._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_2e8._6_2_ = (short)((ulong)uVar8 >> 0x30);
      uStack_2e0._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_2e0._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_2e0._6_2_ = (short)((ulong)uVar12 >> 0x30);
      local_308 = CONCAT11((char)uStack_bb0,(undefined1)uStack_370) +
                  CONCAT11((char)uStack_bb0,(undefined1)uStack_390);
      sStack_306 = local_2d8._2_2_ + local_2e8._2_2_;
      sStack_304 = local_2d8._4_2_ + local_2e8._4_2_;
      sStack_302 = local_2d8._6_2_ + local_2e8._6_2_;
      sStack_300 = CONCAT11(uStack_bb0._4_1_,uStack_370._4_1_) +
                   CONCAT11(uStack_bb0._4_1_,uStack_390._4_1_);
      sStack_2fe = uStack_2d0._2_2_ + uStack_2e0._2_2_;
      sStack_2fc = uStack_2d0._4_2_ + uStack_2e0._4_2_;
      sStack_2fa = uStack_2d0._6_2_ + uStack_2e0._6_2_;
      local_11d8._0_4_ = CONCAT22(sStack_2f6 + sStack_306,local_2f8 + local_308);
      local_11d8._0_6_ = CONCAT24(sStack_2f4 + sStack_304,(undefined4)local_11d8);
      local_11d8 = CONCAT26(sStack_2f2 + sStack_302,(undefined6)local_11d8);
      uStack_11d0._0_4_ = CONCAT22(sStack_2ee + sStack_2fe,sStack_2f0 + sStack_300);
      uStack_11d0._0_6_ = CONCAT24(sStack_2ec + sStack_2fc,(undefined4)uStack_11d0);
      uStack_11d0 = CONCAT26(sStack_2ea + sStack_2fa,(undefined6)uStack_11d0);
      uVar10 = CONCAT13(uStack_bb0._1_1_,
                        CONCAT12(uStack_390._1_1_,CONCAT11((char)uStack_bb0,(undefined1)uStack_390))
                       );
      uVar11 = CONCAT15(uStack_bb0._2_1_,CONCAT14(uStack_390._2_1_,uVar10));
      uVar9 = CONCAT17(uStack_bb0._3_1_,CONCAT16(uStack_390._3_1_,uVar11));
      uVar14 = CONCAT13(uStack_bb0._5_1_,
                        CONCAT12(uStack_390._5_1_,CONCAT11(uStack_bb0._4_1_,uStack_390._4_1_)));
      uVar15 = CONCAT15(uStack_bb0._6_1_,CONCAT14(uStack_390._6_1_,uVar14));
      uVar13 = CONCAT17(uStack_bb0._7_1_,CONCAT16(uStack_390._7_1_,uVar15));
      uVar3 = CONCAT13(uStack_bb0._1_1_,
                       CONCAT12(uStack_3b0._1_1_,CONCAT11((char)uStack_bb0,(undefined1)uStack_3b0)))
      ;
      uVar4 = CONCAT15(uStack_bb0._2_1_,CONCAT14(uStack_3b0._2_1_,uVar3));
      uVar2 = CONCAT17(uStack_bb0._3_1_,CONCAT16(uStack_3b0._3_1_,uVar4));
      uVar6 = CONCAT13(uStack_bb0._5_1_,
                       CONCAT12(uStack_3b0._5_1_,CONCAT11(uStack_bb0._4_1_,uStack_3b0._4_1_)));
      uVar7 = CONCAT15(uStack_bb0._6_1_,CONCAT14(uStack_3b0._6_1_,uVar6));
      uVar5 = CONCAT17(uStack_bb0._7_1_,CONCAT16(uStack_3b0._7_1_,uVar7));
      local_318._2_2_ = (short)((uint)uVar10 >> 0x10);
      local_318._4_2_ = (short)((uint6)uVar11 >> 0x20);
      local_318._6_2_ = (short)((ulong)uVar9 >> 0x30);
      uStack_310._2_2_ = (short)((uint)uVar14 >> 0x10);
      uStack_310._4_2_ = (short)((uint6)uVar15 >> 0x20);
      uStack_310._6_2_ = (short)((ulong)uVar13 >> 0x30);
      local_328._2_2_ = (short)((uint)uVar3 >> 0x10);
      local_328._4_2_ = (short)((uint6)uVar4 >> 0x20);
      local_328._6_2_ = (short)((ulong)uVar2 >> 0x30);
      uStack_320._2_2_ = (short)((uint)uVar6 >> 0x10);
      uStack_320._4_2_ = (short)((uint6)uVar7 >> 0x20);
      uStack_320._6_2_ = (short)((ulong)uVar5 >> 0x30);
      local_338 = CONCAT11((char)uStack_bb0,(undefined1)uStack_390) +
                  CONCAT11((char)uStack_bb0,(undefined1)uStack_3b0);
      sStack_336 = local_318._2_2_ + local_328._2_2_;
      sStack_334 = local_318._4_2_ + local_328._4_2_;
      sStack_332 = local_318._6_2_ + local_328._6_2_;
      sStack_330 = CONCAT11(uStack_bb0._4_1_,uStack_390._4_1_) +
                   CONCAT11(uStack_bb0._4_1_,uStack_3b0._4_1_);
      sStack_32e = uStack_310._2_2_ + uStack_320._2_2_;
      sStack_32c = uStack_310._4_2_ + uStack_320._4_2_;
      sStack_32a = uStack_310._6_2_ + uStack_320._6_2_;
      local_348 = local_11d8;
      lStack_340 = uStack_11d0;
      local_11d8._0_4_ =
           CONCAT22(sStack_336 + sStack_2f6 + sStack_306,local_338 + local_2f8 + local_308);
      local_11d8._0_6_ = CONCAT24(sStack_334 + sStack_2f4 + sStack_304,(undefined4)local_11d8);
      local_11d8 = CONCAT26(sStack_332 + sStack_2f2 + sStack_302,(undefined6)local_11d8);
      uStack_11d0._0_4_ =
           CONCAT22(sStack_32e + sStack_2ee + sStack_2fe,sStack_330 + sStack_2f0 + sStack_300);
      uStack_11d0._0_6_ = CONCAT24(sStack_32c + sStack_2ec + sStack_2fc,(undefined4)uStack_11d0);
      uStack_11d0 = CONCAT26(sStack_32a + sStack_2ea + sStack_2fa,(undefined6)uStack_11d0);
      local_e28 = uVar71;
      local_e08 = uVar92;
      local_de8 = uVar93;
      local_dc8 = uVar96;
      local_da8 = uVar97;
      local_d88 = uVar72;
      local_c08 = local_ef8;
      uStack_c00 = uStack_ef0;
      local_be8 = uVar73;
      uStack_be0 = uVar74;
      local_bd8 = local_1038;
      uStack_bd0 = uStack_1030;
      local_bc8 = local_1038;
      uStack_bc0 = uStack_1030;
      local_bb8 = uVar75;
      uStack_bb0 = uVar76;
      local_ba8 = lVar77;
      uStack_ba0 = lVar78;
      local_a08 = uVar79;
      uStack_a00 = uVar80;
      local_9e8 = uVar81;
      uStack_9e0 = uVar82;
      local_9c8 = uVar83;
      uStack_9c0 = uVar84;
      local_998 = local_1098;
      uStack_990 = uStack_1090;
      local_978 = local_1058;
      uStack_970 = uStack_1050;
      local_958 = local_1078;
      uStack_950 = uStack_1070;
      local_938 = local_1068;
      uStack_930 = uStack_1060;
      local_918 = local_1078;
      uStack_910 = uStack_1070;
      local_8f8 = local_1068;
      uStack_8f0 = uStack_1060;
      local_7d8 = local_1058;
      uStack_7d0 = uStack_1050;
      local_7b8 = local_1058;
      uStack_7b0 = uStack_1050;
      local_798 = local_1058;
      uStack_790 = uStack_1050;
      local_778 = local_1058;
      uStack_770 = uStack_1050;
      local_738 = local_1058;
      uStack_730 = uStack_1050;
      local_718 = local_1058;
      uStack_710 = uStack_1050;
      local_6f8 = local_1058;
      uStack_6f0 = uStack_1050;
      local_6d8 = local_1058;
      uStack_6d0 = uStack_1050;
      local_628 = local_648;
      uStack_620 = uStack_640;
      local_618 = local_668;
      uStack_610 = uStack_660;
      local_5f8 = local_678;
      uStack_5f0 = uStack_670;
      local_5e8 = local_608;
      uStack_5e0 = uStack_600;
      local_5d8 = local_1088;
      uStack_5d0 = uStack_1080;
      local_5c8 = local_658;
      uStack_5c0 = uStack_650;
      local_5a8 = local_638;
      uStack_5a0 = uStack_630;
      local_598 = local_1048;
      uStack_590 = uStack_1040;
      local_578 = local_1038;
      uStack_570 = uStack_1030;
      local_568 = local_588;
      uStack_560 = uStack_580;
      local_4f8 = uVar79;
      uStack_4f0 = uVar80;
      local_4d8 = uVar81;
      uStack_4d0 = uVar82;
      local_4b8 = uVar83;
      uStack_4b0 = uVar84;
      local_428 = local_8b8;
      uStack_420 = uStack_8b0;
      uStack_3f0 = uVar85;
      uStack_3d0 = uVar86;
      uStack_3b0 = uVar87;
      uStack_390 = uVar88;
      uStack_370 = uVar89;
      uStack_350 = uVar90;
      local_328 = uVar2;
      uStack_320 = uVar5;
      local_318 = uVar9;
      uStack_310 = uVar13;
      local_2e8 = uVar8;
      uStack_2e0 = uVar12;
      local_2d8 = uVar17;
      uStack_2d0 = uVar19;
      local_2b8 = uVar16;
      uStack_2b0 = uVar18;
      local_288 = uVar22;
      uStack_280 = uVar25;
      local_278 = uVar21;
      uStack_270 = uVar24;
      local_268 = local_10f8;
      uStack_260 = uStack_10f0;
      local_258 = uVar20;
      uStack_250 = uVar23;
      local_228 = uVar26;
      uStack_220 = uVar27;
      local_218 = uVar29;
      uStack_210 = uVar31;
      local_1e8 = uVar28;
      uStack_1e0 = uVar30;
      local_1d8 = uVar33;
      uStack_1d0 = uVar35;
      local_1b8 = uVar32;
      uStack_1b0 = uVar34;
      local_188 = uVar38;
      uStack_180 = uVar41;
      local_178 = uVar37;
      uStack_170 = uVar40;
      local_168 = local_10f8;
      uStack_160 = uStack_10f0;
      local_158 = uVar36;
      uStack_150 = uVar39;
      local_108 = local_1038;
      uStack_100 = uStack_1030;
      local_e8 = local_1048;
      uStack_e0 = uStack_1040;
      local_c8 = local_1058;
      uStack_c0 = uStack_1050;
      local_a8 = local_1068;
      uStack_a0 = uStack_1060;
      local_88 = local_1078;
      uStack_80 = uStack_1070;
      local_68 = local_1088;
      uStack_60 = uStack_1080;
      local_48 = local_1098;
      uStack_40 = uStack_1090;
      local_28 = local_10f8;
      uStack_20 = uStack_10f0;
      filter8_mask((__m128i *)&local_ef8,(__m128i *)&local_f68,(__m128i *)&local_11c8,
                   (__m128i *)&local_11d8);
      local_c30 = (undefined8 *)((long)local_e50 - (long)(local_e54 << 1));
      *local_c30 = extraout_XMM0_Qa_07;
      local_c30[1] = extraout_XMM0_Qb_07;
      filter_add2_sub2((__m128i *)&local_11c8,(__m128i *)&local_1138,(__m128i *)&local_1148,
                       (__m128i *)&local_1108,(__m128i *)&local_1108);
      filter_add2_sub2((__m128i *)&local_11d8,(__m128i *)&local_1198,(__m128i *)&local_11a8,
                       (__m128i *)&local_1168,(__m128i *)&local_1168);
      filter8_mask((__m128i *)&local_ef8,(__m128i *)&local_f78,(__m128i *)&local_11c8,
                   (__m128i *)&local_11d8);
      local_c50 = (undefined8 *)((long)local_e50 - (long)local_e54);
      *local_c50 = extraout_XMM0_Qa_08;
      local_c50[1] = extraout_XMM0_Qb_08;
      filter_add2_sub2((__m128i *)&local_11c8,(__m128i *)&local_1148,(__m128i *)&local_1158,
                       (__m128i *)&local_1118,(__m128i *)&local_1108);
      filter_add2_sub2((__m128i *)&local_11d8,(__m128i *)&local_11a8,(__m128i *)&local_11b8,
                       (__m128i *)&local_1178,(__m128i *)&local_1168);
      filter8_mask((__m128i *)&local_ef8,(__m128i *)&local_f88,(__m128i *)&local_11c8,
                   (__m128i *)&local_11d8);
      local_c70 = local_e50;
      *local_e50 = extraout_XMM0_Qa_09;
      local_e50[1] = extraout_XMM0_Qb_09;
      filter_add2_sub2((__m128i *)&local_11c8,(__m128i *)&local_1158,(__m128i *)&local_1158,
                       (__m128i *)&local_1128,(__m128i *)&local_1118);
      filter_add2_sub2((__m128i *)&local_11d8,(__m128i *)&local_11b8,(__m128i *)&local_11b8,
                       (__m128i *)&local_1188,(__m128i *)&local_1178);
      filter8_mask((__m128i *)&local_ef8,(__m128i *)&local_f98,(__m128i *)&local_11c8,
                   (__m128i *)&local_11d8);
      *(undefined8 *)((long)local_e50 + (long)local_e54) = extraout_XMM0_Qa_10;
      ((undefined8 *)((long)local_e50 + (long)local_e54))[1] = extraout_XMM0_Qb_10;
    }
  }
  return;
}

Assistant:

void aom_lpf_horizontal_6_quad_sse2(unsigned char *s, int p,
                                    const unsigned char *_blimit0,
                                    const unsigned char *_limit0,
                                    const unsigned char *_thresh0) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi8(1);
  const __m128i blimit_v = _mm_load_si128((const __m128i *)_blimit0);
  const __m128i limit_v = _mm_load_si128((const __m128i *)_limit0);
  const __m128i thresh_v = _mm_load_si128((const __m128i *)_thresh0);
  __m128i mask, hev, flat;
  __m128i p2, p1, p0, q0, q1, q2;

  __m128i op1, op0, oq0, oq1;

  __m128i max_abs_p1p0q1q0;

  p2 = _mm_loadu_si128((__m128i *)(s - 3 * p));
  p1 = _mm_loadu_si128((__m128i *)(s - 2 * p));
  p0 = _mm_loadu_si128((__m128i *)(s - 1 * p));
  q0 = _mm_loadu_si128((__m128i *)(s - 0 * p));
  q1 = _mm_loadu_si128((__m128i *)(s + 1 * p));
  q2 = _mm_loadu_si128((__m128i *)(s + 2 * p));

  {
    const __m128i abs_p1p0 = abs_diff(p1, p0);
    const __m128i abs_q1q0 = abs_diff(q1, q0);
    const __m128i fe = _mm_set1_epi8((int8_t)0xfe);
    const __m128i ff = _mm_cmpeq_epi8(zero, zero);
    __m128i abs_p0q0 = abs_diff(p0, q0);
    __m128i abs_p1q1 = abs_diff(p1, q1);
    __m128i work;
    max_abs_p1p0q1q0 = _mm_max_epu8(abs_p1p0, abs_q1q0);

    abs_p0q0 = _mm_adds_epu8(abs_p0q0, abs_p0q0);
    abs_p1q1 = _mm_srli_epi16(_mm_and_si128(abs_p1q1, fe), 1);
    mask = _mm_subs_epu8(_mm_adds_epu8(abs_p0q0, abs_p1q1), blimit_v);
    mask = _mm_xor_si128(_mm_cmpeq_epi8(mask, zero), ff);
    // mask |= (abs(p0 - q0) * 2 + abs(p1 - q1) / 2  > blimit) * -1;
    mask = _mm_max_epu8(max_abs_p1p0q1q0, mask);
    // mask |= (abs(p1 - p0) > limit) * -1;
    // mask |= (abs(q1 - q0) > limit) * -1;
    work = _mm_max_epu8(abs_diff(p2, p1), abs_diff(q2, q1));
    mask = _mm_max_epu8(work, mask);
    mask = _mm_subs_epu8(mask, limit_v);
    mask = _mm_cmpeq_epi8(mask, zero);
  }

  if (0xffff == _mm_movemask_epi8(_mm_cmpeq_epi8(mask, zero))) return;

  {
    __m128i work;
    work = _mm_max_epu8(abs_diff(p2, p0), abs_diff(q2, q0));
    flat = _mm_max_epu8(work, max_abs_p1p0q1q0);
    flat = _mm_subs_epu8(flat, one);
    flat = _mm_cmpeq_epi8(flat, zero);
    flat = _mm_and_si128(flat, mask);
  }

  // ~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~
  // filter4
  {
    const __m128i t4 = _mm_set1_epi8(4);
    const __m128i t3 = _mm_set1_epi8(3);
    const __m128i t80 = _mm_set1_epi8((int8_t)0x80);
    const __m128i te0 = _mm_set1_epi8((int8_t)0xe0);
    const __m128i t1f = _mm_set1_epi8(0x1f);
    const __m128i t1 = _mm_set1_epi8(0x1);
    const __m128i t7f = _mm_set1_epi8(0x7f);
    const __m128i ff = _mm_cmpeq_epi8(t4, t4);

    __m128i filt;
    __m128i work_a;
    __m128i filter1, filter2;

    op1 = _mm_xor_si128(p1, t80);
    op0 = _mm_xor_si128(p0, t80);
    oq0 = _mm_xor_si128(q0, t80);
    oq1 = _mm_xor_si128(q1, t80);

    hev = _mm_subs_epu8(max_abs_p1p0q1q0, thresh_v);
    hev = _mm_xor_si128(_mm_cmpeq_epi8(hev, zero), ff);
    filt = _mm_and_si128(_mm_subs_epi8(op1, oq1), hev);

    work_a = _mm_subs_epi8(oq0, op0);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_and_si128(filt, mask);
    filter1 = _mm_adds_epi8(filt, t4);
    filter2 = _mm_adds_epi8(filt, t3);

    work_a = _mm_cmpgt_epi8(zero, filter1);
    filter1 = _mm_srli_epi16(filter1, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter1 = _mm_and_si128(filter1, t1f);
    filter1 = _mm_or_si128(filter1, work_a);
    oq0 = _mm_xor_si128(_mm_subs_epi8(oq0, filter1), t80);

    work_a = _mm_cmpgt_epi8(zero, filter2);
    filter2 = _mm_srli_epi16(filter2, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter2 = _mm_and_si128(filter2, t1f);
    filter2 = _mm_or_si128(filter2, work_a);
    op0 = _mm_xor_si128(_mm_adds_epi8(op0, filter2), t80);

    filt = _mm_adds_epi8(filter1, t1);
    work_a = _mm_cmpgt_epi8(zero, filt);
    filt = _mm_srli_epi16(filt, 1);
    work_a = _mm_and_si128(work_a, t80);
    filt = _mm_and_si128(filt, t7f);
    filt = _mm_or_si128(filt, work_a);
    filt = _mm_andnot_si128(hev, filt);
    op1 = _mm_xor_si128(_mm_adds_epi8(op1, filt), t80);
    oq1 = _mm_xor_si128(_mm_subs_epi8(oq1, filt), t80);

    // ~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~
    // filter6
    if (0xffff != _mm_movemask_epi8(_mm_cmpeq_epi8(flat, zero))) {
      const __m128i four = _mm_set1_epi16(4);
      const __m128i p2_lo = _mm_unpacklo_epi8(p2, zero);
      const __m128i p1_lo = _mm_unpacklo_epi8(p1, zero);
      const __m128i p0_lo = _mm_unpacklo_epi8(p0, zero);
      const __m128i q0_lo = _mm_unpacklo_epi8(q0, zero);
      const __m128i q1_lo = _mm_unpacklo_epi8(q1, zero);
      const __m128i q2_lo = _mm_unpacklo_epi8(q2, zero);

      const __m128i p2_hi = _mm_unpackhi_epi8(p2, zero);
      const __m128i p1_hi = _mm_unpackhi_epi8(p1, zero);
      const __m128i p0_hi = _mm_unpackhi_epi8(p0, zero);
      const __m128i q0_hi = _mm_unpackhi_epi8(q0, zero);
      const __m128i q1_hi = _mm_unpackhi_epi8(q1, zero);
      const __m128i q2_hi = _mm_unpackhi_epi8(q2, zero);
      __m128i f8_lo, f8_hi;

      f8_lo = _mm_add_epi16(_mm_add_epi16(p2_lo, four),
                            _mm_add_epi16(p2_lo, p2_lo));
      f8_lo = _mm_add_epi16(_mm_add_epi16(p1_lo, f8_lo),
                            _mm_add_epi16(p1_lo, p0_lo));
      f8_lo = _mm_add_epi16(_mm_add_epi16(p0_lo, q0_lo), f8_lo);

      f8_hi = _mm_add_epi16(_mm_add_epi16(p2_hi, four),
                            _mm_add_epi16(p2_hi, p2_hi));
      f8_hi = _mm_add_epi16(_mm_add_epi16(p1_hi, f8_hi),
                            _mm_add_epi16(p1_hi, p0_hi));
      f8_hi = _mm_add_epi16(_mm_add_epi16(p0_hi, q0_hi), f8_hi);

      op1 = filter8_mask(&flat, &op1, &f8_lo, &f8_hi);
      _mm_storeu_si128((__m128i *)(s - 2 * p), op1);

      f8_lo = filter_add2_sub2(&f8_lo, &q0_lo, &q1_lo, &p2_lo, &p2_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q0_hi, &q1_hi, &p2_hi, &p2_hi);
      op0 = filter8_mask(&flat, &op0, &f8_lo, &f8_hi);
      _mm_storeu_si128((__m128i *)(s - 1 * p), op0);

      f8_lo = filter_add2_sub2(&f8_lo, &q1_lo, &q2_lo, &p1_lo, &p2_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q1_hi, &q2_hi, &p1_hi, &p2_hi);
      oq0 = filter8_mask(&flat, &oq0, &f8_lo, &f8_hi);
      _mm_storeu_si128((__m128i *)(s - 0 * p), oq0);

      f8_lo = filter_add2_sub2(&f8_lo, &q2_lo, &q2_lo, &p0_lo, &p1_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q2_hi, &q2_hi, &p0_hi, &p1_hi);
      oq1 = filter8_mask(&flat, &oq1, &f8_lo, &f8_hi);
      _mm_storeu_si128((__m128i *)(s + 1 * p), oq1);
    } else {
      _mm_storeu_si128((__m128i *)(s - 2 * p), op1);
      _mm_storeu_si128((__m128i *)(s - 1 * p), op0);
      _mm_storeu_si128((__m128i *)(s - 0 * p), oq0);
      _mm_storeu_si128((__m128i *)(s + 1 * p), oq1);
    }
  }
}